

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_16,_16777232,_false,_embree::avx512::ArrayIntersectorK_1<16,_embree::avx512::TriangleMiMBIntersectorKMoeller<4,_16,_true>_>,_true>
     ::occluded(vint<16> *valid_i,Intersectors *This,RayK<16> *ray,RayQueryContext *context)

{
  Ref<embree::Geometry> *pRVar1;
  Geometry *pGVar2;
  long lVar3;
  long lVar4;
  RTCFilterFunctionN p_Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  byte bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  ulong uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  size_t k;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  AABBNodeMB4D *node1;
  ushort uVar49;
  long lVar50;
  ulong uVar51;
  undefined1 (*pauVar52) [64];
  NodeRef root;
  ulong uVar53;
  uint uVar54;
  uint uVar55;
  ulong *puVar56;
  undefined4 uVar57;
  uint uVar58;
  bool bVar59;
  ulong uVar60;
  ulong uVar61;
  int iVar62;
  undefined1 auVar63 [16];
  int iVar87;
  int iVar88;
  int iVar90;
  int iVar91;
  int iVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  int iVar89;
  int iVar101;
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 aVar69;
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 aVar77;
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar104 [64];
  anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 in_ZMM14;
  undefined1 in_ZMM21 [64];
  vuint<4> *v;
  Precalculations pre;
  vint<16> itime;
  Vec3<embree::vfloat_impl<16>_> p1;
  Vec3<embree::vfloat_impl<16>_> p0;
  TravRayK<16,_false> tray;
  NodeRef stack_node [561];
  vfloat<16> stack_near [561];
  uint local_a8e8;
  Precalculations local_a8c1;
  ulong local_a8c0;
  ulong local_a8b8;
  uint local_a8ac;
  RayK<16> *local_a8a8;
  BVH *local_a8a0;
  Intersectors *local_a898;
  ulong local_a890;
  ulong local_a888;
  undefined1 local_a880 [16];
  RTCRayQueryContext *pRStack_a870;
  RayK<16> *pRStack_a868;
  undefined8 *puStack_a860;
  undefined4 uStack_a858;
  undefined1 auStack_a854 [20];
  undefined1 local_a840 [64];
  undefined8 local_a7e0;
  undefined8 uStack_a7d8;
  undefined8 local_a7d0;
  undefined8 uStack_a7c8;
  anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 local_a7c0;
  undefined1 local_a780 [64];
  undefined1 local_a740 [64];
  undefined8 local_a700;
  undefined8 uStack_a6f8;
  undefined8 uStack_a6f0;
  undefined8 uStack_a6e8;
  undefined8 uStack_a6e0;
  undefined8 uStack_a6d8;
  undefined8 uStack_a6d0;
  undefined8 uStack_a6c8;
  undefined8 local_a6c0;
  undefined8 uStack_a6b8;
  undefined8 uStack_a6b0;
  undefined8 uStack_a6a8;
  undefined8 uStack_a6a0;
  undefined8 uStack_a698;
  undefined8 uStack_a690;
  undefined8 uStack_a688;
  undefined8 local_a680;
  undefined8 uStack_a678;
  undefined8 uStack_a670;
  undefined8 uStack_a668;
  undefined8 uStack_a660;
  undefined8 uStack_a658;
  undefined8 uStack_a650;
  undefined8 uStack_a648;
  undefined1 local_a640 [64];
  undefined1 local_a600 [64];
  undefined1 local_a5c0 [64];
  undefined1 local_a580 [64];
  undefined1 local_a540 [64];
  undefined1 local_a500 [64];
  int local_a4c0;
  int iStack_a4bc;
  int iStack_a4b8;
  int iStack_a4b4;
  int iStack_a4b0;
  int iStack_a4ac;
  int iStack_a4a8;
  int iStack_a4a4;
  int iStack_a4a0;
  int iStack_a49c;
  int iStack_a498;
  int iStack_a494;
  int iStack_a490;
  int iStack_a48c;
  int iStack_a488;
  int iStack_a484;
  anon_union_192_2_4062524c_for_Vec3<embree::vfloat_impl<16>_>_1 local_a480;
  undefined1 local_a3c0 [64];
  undefined1 local_a380 [64];
  undefined1 local_a340 [64];
  undefined1 local_a300 [64];
  undefined1 local_a2c0 [64];
  undefined1 local_a280 [64];
  undefined1 local_a240 [64];
  undefined1 local_a200 [64];
  anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 local_a1c0;
  undefined1 local_a180 [64];
  undefined1 local_a140 [64];
  undefined1 local_a100 [64];
  uint local_a0c0;
  uint uStack_a0bc;
  uint uStack_a0b8;
  uint uStack_a0b4;
  uint uStack_a0b0;
  uint uStack_a0ac;
  uint uStack_a0a8;
  uint uStack_a0a4;
  uint uStack_a0a0;
  uint uStack_a09c;
  uint uStack_a098;
  uint uStack_a094;
  uint uStack_a090;
  uint uStack_a08c;
  uint uStack_a088;
  uint uStack_a084;
  undefined1 local_a080 [64];
  undefined1 local_a040 [64];
  undefined1 local_a000 [64];
  undefined1 local_9fc0 [64];
  undefined1 local_9f80 [64];
  undefined1 local_9f40 [64];
  anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 local_9f00;
  undefined1 local_9ec0 [64];
  undefined8 local_9e50;
  size_t local_9e48;
  ulong local_9e40 [560];
  undefined1 local_8cc0 [64];
  uint local_8c80;
  uint uStack_8c7c;
  uint uStack_8c78;
  uint uStack_8c74;
  uint uStack_8c70;
  uint uStack_8c6c;
  uint uStack_8c68;
  uint uStack_8c64;
  uint uStack_8c60;
  uint uStack_8c5c;
  uint uStack_8c58;
  uint uStack_8c54;
  uint uStack_8c50;
  uint uStack_8c4c;
  uint uStack_8c48;
  uint uStack_8c44;
  undefined1 local_8c40 [35856];
  
  local_a8a0 = (BVH *)This->ptr;
  local_9e48 = (local_a8a0->root).ptr;
  if (local_9e48 != 8) {
    auVar64 = vpternlogd_avx512f(in_ZMM2,in_ZMM2,in_ZMM2,0xff);
    auVar103 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar60 = vcmpps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar103,5);
    uVar51 = vpcmpeqd_avx512f(auVar64,(undefined1  [64])valid_i->field_0);
    uVar60 = uVar60 & uVar51;
    if ((ushort)uVar60 != 0) {
      local_a480.field_0.x.field_0 =
           (vfloat_impl<16>)(vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)ray;
      local_a480.field_0.y.field_0 =
           (vfloat_impl<16>)
           (vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x40);
      local_a480.field_0.z.field_0 =
           (vfloat_impl<16>)
           (vfloat_impl<16>)*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x80);
      local_a3c0 = *(undefined1 (*) [64])(ray + 0x100);
      local_a380 = *(undefined1 (*) [64])(ray + 0x140);
      local_a340 = *(undefined1 (*) [64])(ray + 0x180);
      auVar64 = vbroadcastsd_avx512f(ZEXT816(0x7fffffff7fffffff));
      auVar65 = vandps_avx512dq(local_a3c0,auVar64);
      auVar66 = vbroadcastss_avx512f(ZEXT416(0x219392ef));
      uVar51 = vcmpps_avx512f(auVar65,auVar66,1);
      bVar59 = (bool)((byte)uVar51 & 1);
      iVar62 = auVar66._0_4_;
      auVar65._0_4_ = (uint)bVar59 * iVar62 | (uint)!bVar59 * local_a3c0._0_4_;
      bVar59 = (bool)((byte)(uVar51 >> 1) & 1);
      iVar87 = auVar66._4_4_;
      auVar65._4_4_ = (uint)bVar59 * iVar87 | (uint)!bVar59 * local_a3c0._4_4_;
      bVar59 = (bool)((byte)(uVar51 >> 2) & 1);
      iVar88 = auVar66._8_4_;
      auVar65._8_4_ = (uint)bVar59 * iVar88 | (uint)!bVar59 * local_a3c0._8_4_;
      bVar59 = (bool)((byte)(uVar51 >> 3) & 1);
      iVar89 = auVar66._12_4_;
      auVar65._12_4_ = (uint)bVar59 * iVar89 | (uint)!bVar59 * local_a3c0._12_4_;
      bVar59 = (bool)((byte)(uVar51 >> 4) & 1);
      iVar90 = auVar66._16_4_;
      auVar65._16_4_ = (uint)bVar59 * iVar90 | (uint)!bVar59 * local_a3c0._16_4_;
      bVar59 = (bool)((byte)(uVar51 >> 5) & 1);
      iVar91 = auVar66._20_4_;
      auVar65._20_4_ = (uint)bVar59 * iVar91 | (uint)!bVar59 * local_a3c0._20_4_;
      bVar59 = (bool)((byte)(uVar51 >> 6) & 1);
      iVar92 = auVar66._24_4_;
      auVar65._24_4_ = (uint)bVar59 * iVar92 | (uint)!bVar59 * local_a3c0._24_4_;
      bVar59 = (bool)((byte)(uVar51 >> 7) & 1);
      iVar93 = auVar66._28_4_;
      auVar65._28_4_ = (uint)bVar59 * iVar93 | (uint)!bVar59 * local_a3c0._28_4_;
      bVar59 = (bool)((byte)(uVar51 >> 8) & 1);
      iVar94 = auVar66._32_4_;
      auVar65._32_4_ = (uint)bVar59 * iVar94 | (uint)!bVar59 * local_a3c0._32_4_;
      bVar59 = (bool)((byte)(uVar51 >> 9) & 1);
      iVar95 = auVar66._36_4_;
      auVar65._36_4_ = (uint)bVar59 * iVar95 | (uint)!bVar59 * local_a3c0._36_4_;
      bVar59 = (bool)((byte)(uVar51 >> 10) & 1);
      iVar96 = auVar66._40_4_;
      auVar65._40_4_ = (uint)bVar59 * iVar96 | (uint)!bVar59 * local_a3c0._40_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xb) & 1);
      iVar97 = auVar66._44_4_;
      auVar65._44_4_ = (uint)bVar59 * iVar97 | (uint)!bVar59 * local_a3c0._44_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xc) & 1);
      iVar98 = auVar66._48_4_;
      auVar65._48_4_ = (uint)bVar59 * iVar98 | (uint)!bVar59 * local_a3c0._48_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xd) & 1);
      iVar99 = auVar66._52_4_;
      auVar65._52_4_ = (uint)bVar59 * iVar99 | (uint)!bVar59 * local_a3c0._52_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xe) & 1);
      iVar100 = auVar66._56_4_;
      iVar101 = auVar66._60_4_;
      auVar65._56_4_ = (uint)bVar59 * iVar100 | (uint)!bVar59 * local_a3c0._56_4_;
      bVar59 = SUB81(uVar51 >> 0xf,0);
      auVar65._60_4_ = (uint)bVar59 * iVar101 | (uint)!bVar59 * local_a3c0._60_4_;
      auVar67 = vandps_avx512dq(local_a380,auVar64);
      uVar51 = vcmpps_avx512f(auVar67,auVar66,1);
      bVar59 = (bool)((byte)uVar51 & 1);
      auVar67._0_4_ = (uint)bVar59 * iVar62 | (uint)!bVar59 * local_a380._0_4_;
      bVar59 = (bool)((byte)(uVar51 >> 1) & 1);
      auVar67._4_4_ = (uint)bVar59 * iVar87 | (uint)!bVar59 * local_a380._4_4_;
      bVar59 = (bool)((byte)(uVar51 >> 2) & 1);
      auVar67._8_4_ = (uint)bVar59 * iVar88 | (uint)!bVar59 * local_a380._8_4_;
      bVar59 = (bool)((byte)(uVar51 >> 3) & 1);
      auVar67._12_4_ = (uint)bVar59 * iVar89 | (uint)!bVar59 * local_a380._12_4_;
      bVar59 = (bool)((byte)(uVar51 >> 4) & 1);
      auVar67._16_4_ = (uint)bVar59 * iVar90 | (uint)!bVar59 * local_a380._16_4_;
      bVar59 = (bool)((byte)(uVar51 >> 5) & 1);
      auVar67._20_4_ = (uint)bVar59 * iVar91 | (uint)!bVar59 * local_a380._20_4_;
      bVar59 = (bool)((byte)(uVar51 >> 6) & 1);
      auVar67._24_4_ = (uint)bVar59 * iVar92 | (uint)!bVar59 * local_a380._24_4_;
      bVar59 = (bool)((byte)(uVar51 >> 7) & 1);
      auVar67._28_4_ = (uint)bVar59 * iVar93 | (uint)!bVar59 * local_a380._28_4_;
      bVar59 = (bool)((byte)(uVar51 >> 8) & 1);
      auVar67._32_4_ = (uint)bVar59 * iVar94 | (uint)!bVar59 * local_a380._32_4_;
      bVar59 = (bool)((byte)(uVar51 >> 9) & 1);
      auVar67._36_4_ = (uint)bVar59 * iVar95 | (uint)!bVar59 * local_a380._36_4_;
      bVar59 = (bool)((byte)(uVar51 >> 10) & 1);
      auVar67._40_4_ = (uint)bVar59 * iVar96 | (uint)!bVar59 * local_a380._40_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xb) & 1);
      auVar67._44_4_ = (uint)bVar59 * iVar97 | (uint)!bVar59 * local_a380._44_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xc) & 1);
      auVar67._48_4_ = (uint)bVar59 * iVar98 | (uint)!bVar59 * local_a380._48_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xd) & 1);
      auVar67._52_4_ = (uint)bVar59 * iVar99 | (uint)!bVar59 * local_a380._52_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xe) & 1);
      auVar67._56_4_ = (uint)bVar59 * iVar100 | (uint)!bVar59 * local_a380._56_4_;
      bVar59 = SUB81(uVar51 >> 0xf,0);
      auVar67._60_4_ = (uint)bVar59 * iVar101 | (uint)!bVar59 * local_a380._60_4_;
      auVar64 = vandps_avx512dq(local_a340,auVar64);
      uVar51 = vcmpps_avx512f(auVar64,auVar66,1);
      auVar66 = vrcp14ps_avx512f(auVar65);
      bVar59 = (bool)((byte)uVar51 & 1);
      auVar76._0_4_ = (uint)bVar59 * iVar62 | (uint)!bVar59 * local_a340._0_4_;
      bVar59 = (bool)((byte)(uVar51 >> 1) & 1);
      auVar76._4_4_ = (uint)bVar59 * iVar87 | (uint)!bVar59 * local_a340._4_4_;
      bVar59 = (bool)((byte)(uVar51 >> 2) & 1);
      auVar76._8_4_ = (uint)bVar59 * iVar88 | (uint)!bVar59 * local_a340._8_4_;
      bVar59 = (bool)((byte)(uVar51 >> 3) & 1);
      auVar76._12_4_ = (uint)bVar59 * iVar89 | (uint)!bVar59 * local_a340._12_4_;
      bVar59 = (bool)((byte)(uVar51 >> 4) & 1);
      auVar76._16_4_ = (uint)bVar59 * iVar90 | (uint)!bVar59 * local_a340._16_4_;
      bVar59 = (bool)((byte)(uVar51 >> 5) & 1);
      auVar76._20_4_ = (uint)bVar59 * iVar91 | (uint)!bVar59 * local_a340._20_4_;
      bVar59 = (bool)((byte)(uVar51 >> 6) & 1);
      auVar76._24_4_ = (uint)bVar59 * iVar92 | (uint)!bVar59 * local_a340._24_4_;
      bVar59 = (bool)((byte)(uVar51 >> 7) & 1);
      auVar76._28_4_ = (uint)bVar59 * iVar93 | (uint)!bVar59 * local_a340._28_4_;
      bVar59 = (bool)((byte)(uVar51 >> 8) & 1);
      auVar76._32_4_ = (uint)bVar59 * iVar94 | (uint)!bVar59 * local_a340._32_4_;
      bVar59 = (bool)((byte)(uVar51 >> 9) & 1);
      auVar76._36_4_ = (uint)bVar59 * iVar95 | (uint)!bVar59 * local_a340._36_4_;
      bVar59 = (bool)((byte)(uVar51 >> 10) & 1);
      auVar76._40_4_ = (uint)bVar59 * iVar96 | (uint)!bVar59 * local_a340._40_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xb) & 1);
      auVar76._44_4_ = (uint)bVar59 * iVar97 | (uint)!bVar59 * local_a340._44_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xc) & 1);
      auVar76._48_4_ = (uint)bVar59 * iVar98 | (uint)!bVar59 * local_a340._48_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xd) & 1);
      auVar76._52_4_ = (uint)bVar59 * iVar99 | (uint)!bVar59 * local_a340._52_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xe) & 1);
      auVar76._56_4_ = (uint)bVar59 * iVar100 | (uint)!bVar59 * local_a340._56_4_;
      bVar59 = SUB81(uVar51 >> 0xf,0);
      auVar76._60_4_ = (uint)bVar59 * iVar101 | (uint)!bVar59 * local_a340._60_4_;
      auVar68 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar64 = vrcp14ps_avx512f(auVar67);
      auVar65 = vfnmadd213ps_avx512f(auVar65,auVar66,auVar68);
      local_a300 = vfmadd132ps_avx512f(auVar65,auVar66,auVar66);
      auVar65 = vfnmadd213ps_avx512f(auVar67,auVar64,auVar68);
      aVar69 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)vrcp14ps_avx512f(auVar76);
      local_a2c0 = vfmadd132ps_avx512f(auVar65,auVar64,auVar64);
      auVar65 = vfnmadd213ps_avx512f(auVar76,(undefined1  [64])aVar69,auVar68);
      local_a280 = vfmadd132ps_avx512f(auVar65,(undefined1  [64])aVar69,(undefined1  [64])aVar69);
      local_a240 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)ray,local_a300)
      ;
      local_a200 = vmulps_avx512f((undefined1  [64])
                                  *(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)(ray + 0x40),
                                  local_a2c0);
      local_a1c0.v = (__m512)vmulps_avx512f(*(anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1 *)
                                             (ray + 0x80),local_a280);
      uVar51 = vcmpps_avx512f(local_a300,auVar103,1);
      auVar65 = vpbroadcastd_avx512f(ZEXT416(0x20));
      auVar66._4_4_ = (uint)((byte)(uVar51 >> 1) & 1) * auVar65._4_4_;
      auVar66._0_4_ = (uint)((byte)uVar51 & 1) * auVar65._0_4_;
      auVar66._8_4_ = (uint)((byte)(uVar51 >> 2) & 1) * auVar65._8_4_;
      auVar66._12_4_ = (uint)((byte)(uVar51 >> 3) & 1) * auVar65._12_4_;
      auVar66._16_4_ = (uint)((byte)(uVar51 >> 4) & 1) * auVar65._16_4_;
      auVar66._20_4_ = (uint)((byte)(uVar51 >> 5) & 1) * auVar65._20_4_;
      auVar66._24_4_ = (uint)((byte)(uVar51 >> 6) & 1) * auVar65._24_4_;
      auVar66._28_4_ = (uint)((byte)(uVar51 >> 7) & 1) * auVar65._28_4_;
      auVar66._32_4_ = (uint)((byte)(uVar51 >> 8) & 1) * auVar65._32_4_;
      auVar66._36_4_ = (uint)((byte)(uVar51 >> 9) & 1) * auVar65._36_4_;
      auVar66._40_4_ = (uint)((byte)(uVar51 >> 10) & 1) * auVar65._40_4_;
      auVar66._44_4_ = (uint)((byte)(uVar51 >> 0xb) & 1) * auVar65._44_4_;
      auVar66._48_4_ = (uint)((byte)(uVar51 >> 0xc) & 1) * auVar65._48_4_;
      auVar66._52_4_ = (uint)((byte)(uVar51 >> 0xd) & 1) * auVar65._52_4_;
      auVar66._56_4_ = (uint)((byte)(uVar51 >> 0xe) & 1) * auVar65._56_4_;
      auVar66._60_4_ = (uint)(byte)(uVar51 >> 0xf) * auVar65._60_4_;
      local_a180 = vmovdqa64_avx512f(auVar66);
      uVar51 = vcmpps_avx512f(local_a2c0,auVar103,5);
      auVar65 = vpbroadcastd_avx512f(ZEXT416(0x60));
      auVar66 = vpbroadcastd_avx512f(ZEXT416(0x40));
      bVar59 = (bool)((byte)uVar51 & 1);
      auVar70._0_4_ = (uint)bVar59 * auVar66._0_4_ | (uint)!bVar59 * auVar65._0_4_;
      bVar59 = (bool)((byte)(uVar51 >> 1) & 1);
      auVar70._4_4_ = (uint)bVar59 * auVar66._4_4_ | (uint)!bVar59 * auVar65._4_4_;
      bVar59 = (bool)((byte)(uVar51 >> 2) & 1);
      auVar70._8_4_ = (uint)bVar59 * auVar66._8_4_ | (uint)!bVar59 * auVar65._8_4_;
      bVar59 = (bool)((byte)(uVar51 >> 3) & 1);
      auVar70._12_4_ = (uint)bVar59 * auVar66._12_4_ | (uint)!bVar59 * auVar65._12_4_;
      bVar59 = (bool)((byte)(uVar51 >> 4) & 1);
      auVar70._16_4_ = (uint)bVar59 * auVar66._16_4_ | (uint)!bVar59 * auVar65._16_4_;
      bVar59 = (bool)((byte)(uVar51 >> 5) & 1);
      auVar70._20_4_ = (uint)bVar59 * auVar66._20_4_ | (uint)!bVar59 * auVar65._20_4_;
      bVar59 = (bool)((byte)(uVar51 >> 6) & 1);
      auVar70._24_4_ = (uint)bVar59 * auVar66._24_4_ | (uint)!bVar59 * auVar65._24_4_;
      bVar59 = (bool)((byte)(uVar51 >> 7) & 1);
      auVar70._28_4_ = (uint)bVar59 * auVar66._28_4_ | (uint)!bVar59 * auVar65._28_4_;
      bVar59 = (bool)((byte)(uVar51 >> 8) & 1);
      auVar70._32_4_ = (uint)bVar59 * auVar66._32_4_ | (uint)!bVar59 * auVar65._32_4_;
      bVar59 = (bool)((byte)(uVar51 >> 9) & 1);
      auVar70._36_4_ = (uint)bVar59 * auVar66._36_4_ | (uint)!bVar59 * auVar65._36_4_;
      bVar59 = (bool)((byte)(uVar51 >> 10) & 1);
      auVar70._40_4_ = (uint)bVar59 * auVar66._40_4_ | (uint)!bVar59 * auVar65._40_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xb) & 1);
      auVar70._44_4_ = (uint)bVar59 * auVar66._44_4_ | (uint)!bVar59 * auVar65._44_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xc) & 1);
      auVar70._48_4_ = (uint)bVar59 * auVar66._48_4_ | (uint)!bVar59 * auVar65._48_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xd) & 1);
      auVar70._52_4_ = (uint)bVar59 * auVar66._52_4_ | (uint)!bVar59 * auVar65._52_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xe) & 1);
      auVar70._56_4_ = (uint)bVar59 * auVar66._56_4_ | (uint)!bVar59 * auVar65._56_4_;
      bVar59 = SUB81(uVar51 >> 0xf,0);
      auVar70._60_4_ = (uint)bVar59 * auVar66._60_4_ | (uint)!bVar59 * auVar65._60_4_;
      local_a140 = vmovdqa64_avx512f(auVar70);
      uVar51 = vcmpps_avx512f(local_a280,auVar103,5);
      auVar65 = vpbroadcastd_avx512f(ZEXT416(0xa0));
      auVar66 = vpbroadcastd_avx512f(ZEXT416(0x80));
      bVar59 = (bool)((byte)uVar51 & 1);
      auVar71._0_4_ = (uint)bVar59 * auVar66._0_4_ | (uint)!bVar59 * auVar65._0_4_;
      bVar59 = (bool)((byte)(uVar51 >> 1) & 1);
      auVar71._4_4_ = (uint)bVar59 * auVar66._4_4_ | (uint)!bVar59 * auVar65._4_4_;
      bVar59 = (bool)((byte)(uVar51 >> 2) & 1);
      auVar71._8_4_ = (uint)bVar59 * auVar66._8_4_ | (uint)!bVar59 * auVar65._8_4_;
      bVar59 = (bool)((byte)(uVar51 >> 3) & 1);
      auVar71._12_4_ = (uint)bVar59 * auVar66._12_4_ | (uint)!bVar59 * auVar65._12_4_;
      bVar59 = (bool)((byte)(uVar51 >> 4) & 1);
      auVar71._16_4_ = (uint)bVar59 * auVar66._16_4_ | (uint)!bVar59 * auVar65._16_4_;
      bVar59 = (bool)((byte)(uVar51 >> 5) & 1);
      auVar71._20_4_ = (uint)bVar59 * auVar66._20_4_ | (uint)!bVar59 * auVar65._20_4_;
      bVar59 = (bool)((byte)(uVar51 >> 6) & 1);
      auVar71._24_4_ = (uint)bVar59 * auVar66._24_4_ | (uint)!bVar59 * auVar65._24_4_;
      bVar59 = (bool)((byte)(uVar51 >> 7) & 1);
      auVar71._28_4_ = (uint)bVar59 * auVar66._28_4_ | (uint)!bVar59 * auVar65._28_4_;
      bVar59 = (bool)((byte)(uVar51 >> 8) & 1);
      auVar71._32_4_ = (uint)bVar59 * auVar66._32_4_ | (uint)!bVar59 * auVar65._32_4_;
      bVar59 = (bool)((byte)(uVar51 >> 9) & 1);
      auVar71._36_4_ = (uint)bVar59 * auVar66._36_4_ | (uint)!bVar59 * auVar65._36_4_;
      bVar59 = (bool)((byte)(uVar51 >> 10) & 1);
      auVar71._40_4_ = (uint)bVar59 * auVar66._40_4_ | (uint)!bVar59 * auVar65._40_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xb) & 1);
      auVar71._44_4_ = (uint)bVar59 * auVar66._44_4_ | (uint)!bVar59 * auVar65._44_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xc) & 1);
      auVar71._48_4_ = (uint)bVar59 * auVar66._48_4_ | (uint)!bVar59 * auVar65._48_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xd) & 1);
      auVar71._52_4_ = (uint)bVar59 * auVar66._52_4_ | (uint)!bVar59 * auVar65._52_4_;
      bVar59 = (bool)((byte)(uVar51 >> 0xe) & 1);
      auVar71._56_4_ = (uint)bVar59 * auVar66._56_4_ | (uint)!bVar59 * auVar65._56_4_;
      bVar59 = SUB81(uVar51 >> 0xf,0);
      auVar71._60_4_ = (uint)bVar59 * auVar66._60_4_ | (uint)!bVar59 * auVar65._60_4_;
      local_a100 = vmovdqa64_avx512f(auVar71);
      auVar66 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
      local_a8ac = (uint)uVar60;
      auVar65 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0xc0),auVar103);
      bVar59 = (bool)((byte)uVar60 & 1);
      local_a0c0 = (uint)bVar59 * auVar65._0_4_ | (uint)!bVar59 * auVar66._0_4_;
      bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
      uStack_a0bc = (uint)bVar59 * auVar65._4_4_ | (uint)!bVar59 * auVar66._4_4_;
      bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
      uStack_a0b8 = (uint)bVar59 * auVar65._8_4_ | (uint)!bVar59 * auVar66._8_4_;
      bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
      uStack_a0b4 = (uint)bVar59 * auVar65._12_4_ | (uint)!bVar59 * auVar66._12_4_;
      bVar59 = (bool)((byte)(uVar60 >> 4) & 1);
      uStack_a0b0 = (uint)bVar59 * auVar65._16_4_ | (uint)!bVar59 * auVar66._16_4_;
      bVar59 = (bool)((byte)(uVar60 >> 5) & 1);
      uStack_a0ac = (uint)bVar59 * auVar65._20_4_ | (uint)!bVar59 * auVar66._20_4_;
      bVar59 = (bool)((byte)(uVar60 >> 6) & 1);
      uStack_a0a8 = (uint)bVar59 * auVar65._24_4_ | (uint)!bVar59 * auVar66._24_4_;
      bVar59 = (bool)((byte)(uVar60 >> 7) & 1);
      uStack_a0a4 = (uint)bVar59 * auVar65._28_4_ | (uint)!bVar59 * auVar66._28_4_;
      bVar13 = (byte)(uVar60 >> 8);
      bVar59 = (bool)(bVar13 & 1);
      uStack_a0a0 = (uint)bVar59 * auVar65._32_4_ | (uint)!bVar59 * auVar66._32_4_;
      bVar59 = (bool)((byte)(uVar60 >> 9) & 1);
      uStack_a09c = (uint)bVar59 * auVar65._36_4_ | (uint)!bVar59 * auVar66._36_4_;
      bVar59 = (bool)((byte)(uVar60 >> 10) & 1);
      uStack_a098 = (uint)bVar59 * auVar65._40_4_ | (uint)!bVar59 * auVar66._40_4_;
      bVar59 = (bool)((byte)(uVar60 >> 0xb) & 1);
      uStack_a094 = (uint)bVar59 * auVar65._44_4_ | (uint)!bVar59 * auVar66._44_4_;
      bVar59 = (bool)((byte)(uVar60 >> 0xc) & 1);
      uStack_a090 = (uint)bVar59 * auVar65._48_4_ | (uint)!bVar59 * auVar66._48_4_;
      bVar59 = (bool)((byte)(uVar60 >> 0xd) & 1);
      uStack_a08c = (uint)bVar59 * auVar65._52_4_ | (uint)!bVar59 * auVar66._52_4_;
      bVar59 = (bool)((byte)(uVar60 >> 0xe) & 1);
      uStack_a088 = (uint)bVar59 * auVar65._56_4_ | (uint)!bVar59 * auVar66._56_4_;
      bVar59 = SUB81(uVar60 >> 0xf,0);
      uStack_a084 = (uint)bVar59 * auVar65._60_4_ | (uint)!bVar59 * auVar66._60_4_;
      auVar65 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      auVar103 = vmaxps_avx512f(*(undefined1 (*) [64])(ray + 0x200),auVar103);
      bVar59 = (bool)((byte)uVar60 & 1);
      bVar6 = (bool)((byte)(uVar60 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar60 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar60 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar60 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar60 >> 6) & 1);
      bVar12 = (bool)((byte)(uVar60 >> 7) & 1);
      bVar14 = (bool)(bVar13 & 1);
      bVar15 = (bool)((byte)(uVar60 >> 9) & 1);
      bVar16 = (bool)((byte)(uVar60 >> 10) & 1);
      bVar17 = (bool)((byte)(uVar60 >> 0xb) & 1);
      bVar18 = (bool)((byte)(uVar60 >> 0xc) & 1);
      bVar19 = (bool)((byte)(uVar60 >> 0xd) & 1);
      bVar20 = (bool)((byte)(uVar60 >> 0xe) & 1);
      bVar21 = SUB81(uVar60 >> 0xf,0);
      local_a080._4_4_ = (uint)bVar6 * auVar103._4_4_ | (uint)!bVar6 * auVar65._4_4_;
      local_a080._0_4_ = (uint)bVar59 * auVar103._0_4_ | (uint)!bVar59 * auVar65._0_4_;
      local_a080._8_4_ = (uint)bVar7 * auVar103._8_4_ | (uint)!bVar7 * auVar65._8_4_;
      local_a080._12_4_ = (uint)bVar8 * auVar103._12_4_ | (uint)!bVar8 * auVar65._12_4_;
      local_a080._16_4_ = (uint)bVar9 * auVar103._16_4_ | (uint)!bVar9 * auVar65._16_4_;
      local_a080._20_4_ = (uint)bVar10 * auVar103._20_4_ | (uint)!bVar10 * auVar65._20_4_;
      local_a080._24_4_ = (uint)bVar11 * auVar103._24_4_ | (uint)!bVar11 * auVar65._24_4_;
      local_a080._28_4_ = (uint)bVar12 * auVar103._28_4_ | (uint)!bVar12 * auVar65._28_4_;
      local_a080._32_4_ = (uint)bVar14 * auVar103._32_4_ | (uint)!bVar14 * auVar65._32_4_;
      local_a080._36_4_ = (uint)bVar15 * auVar103._36_4_ | (uint)!bVar15 * auVar65._36_4_;
      local_a080._40_4_ = (uint)bVar16 * auVar103._40_4_ | (uint)!bVar16 * auVar65._40_4_;
      local_a080._44_4_ = (uint)bVar17 * auVar103._44_4_ | (uint)!bVar17 * auVar65._44_4_;
      local_a080._48_4_ = (uint)bVar18 * auVar103._48_4_ | (uint)!bVar18 * auVar65._48_4_;
      local_a080._52_4_ = (uint)bVar19 * auVar103._52_4_ | (uint)!bVar19 * auVar65._52_4_;
      local_a080._56_4_ = (uint)bVar20 * auVar103._56_4_ | (uint)!bVar20 * auVar65._56_4_;
      local_a080._60_4_ = (uint)bVar21 * auVar103._60_4_ | (uint)!bVar21 * auVar65._60_4_;
      uVar54 = (uint)(ushort)~(ushort)uVar60;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar55 = 0xe;
      }
      else {
        uVar55 = 2;
        if ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT) {
          uVar55 = 0xe;
        }
      }
      local_a8a8 = ray + 0x200;
      puVar56 = local_9e40;
      pauVar52 = (undefined1 (*) [64])local_8c40;
      local_9e50 = 0xfffffffffffffff8;
      local_8c80 = local_a0c0;
      uStack_8c7c = uStack_a0bc;
      uStack_8c78 = uStack_a0b8;
      uStack_8c74 = uStack_a0b4;
      uStack_8c70 = uStack_a0b0;
      uStack_8c6c = uStack_a0ac;
      uStack_8c68 = uStack_a0a8;
      uStack_8c64 = uStack_a0a4;
      uStack_8c60 = uStack_a0a0;
      uStack_8c5c = uStack_a09c;
      uStack_8c58 = uStack_a098;
      uStack_8c54 = uStack_a094;
      uStack_8c50 = uStack_a090;
      uStack_8c4c = uStack_a08c;
      uStack_8c48 = uStack_a088;
      uStack_8c44 = uStack_a084;
      auVar63 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
      auVar65 = ZEXT1664(auVar63);
      auVar103 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
      local_a898 = This;
      local_8cc0 = auVar66;
LAB_01f61872:
      do {
        do {
          root.ptr = puVar56[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_01f62685;
          puVar56 = puVar56 + -1;
          pauVar52 = pauVar52 + -1;
          auVar78 = *pauVar52;
          uVar60 = vcmpps_avx512f(auVar78,local_a080,1);
        } while ((short)uVar60 == 0);
        uVar57 = (undefined4)uVar60;
        if (uVar55 < (uint)POPCOUNT(uVar57)) {
LAB_01f618b6:
          do {
            uVar58 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_01f62685;
              uVar23 = vcmpps_avx512f(auVar78,local_a080,9);
              if ((short)uVar23 != 0) {
                local_a890 = (ulong)(uVar58 & 0xf) - 8;
                uVar58 = uVar54;
                if (local_a890 != 0) {
                  local_a8e8 = ~uVar54;
                  uVar60 = 0;
                  do {
                    lVar50 = uVar60 * 0x50 + (root.ptr & 0xfffffffffffffff0);
                    local_a8c0 = 0;
                    local_a8b8 = (ulong)(local_a8e8 & 0xffff);
                    for (uVar51 = local_a8b8; (uVar51 & 1) == 0;
                        uVar51 = uVar51 >> 1 | 0x8000000000000000) {
                      local_a8c0 = local_a8c0 + 1;
                    }
                    uVar51 = 0;
                    uVar58 = local_a8e8;
                    local_a888 = uVar60;
                    while( true ) {
                      uVar49 = (ushort)uVar58;
                      if (*(int *)(lVar50 + 0x40 + uVar51 * 4) == -1) break;
                      pRVar1 = (context->scene->geometries).items;
                      pGVar2 = pRVar1[*(uint *)(lVar50 + 0x30 + uVar51 * 4)].ptr;
                      auVar102._8_8_ = 0;
                      auVar102._0_4_ = (pGVar2->time_range).lower;
                      auVar102._4_4_ = (pGVar2->time_range).upper;
                      auVar67 = vbroadcastss_avx512f(auVar102);
                      auVar76 = vbroadcastss_avx512f(ZEXT416((uint)pGVar2->fnumTimeSegments));
                      auVar67 = vsubps_avx512f(*(undefined1 (*) [64])(ray + 0x1c0),auVar67);
                      auVar63 = vmovshdup_avx(auVar102);
                      auVar104 = ZEXT1664(auVar63);
                      auVar63 = vsubps_avx(auVar63,auVar102);
                      auVar70 = vbroadcastss_avx512f(auVar63);
                      auVar67 = vdivps_avx512f(auVar67,auVar70);
                      auVar67 = vmulps_avx512f(auVar76,auVar67);
                      auVar70 = vrndscaleps_avx512f(auVar67,1);
                      auVar63 = vaddss_avx512f(auVar76._0_16_,SUB6416(ZEXT464(0xbf800000),0));
                      auVar76 = vbroadcastss_avx512f(auVar63);
                      auVar76 = vminps_avx512f(auVar70,auVar76);
                      auVar76 = vmaxps_avx512f(auVar76,auVar65);
                      auVar70 = vsubps_avx512f(auVar67,auVar76);
                      aVar77 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)
                               vcvtps2dq_avx512f(auVar76);
                      auVar67 = vmovdqa64_avx512f((undefined1  [64])aVar77);
                      _local_a880 = auVar67;
                      auVar76 = vpbroadcastd_avx512f();
                      uVar23 = vpcmpd_avx512f(auVar76,(undefined1  [64])aVar77,4);
                      local_a840._0_8_ = uVar51;
                      if (((ushort)uVar23 & (ushort)local_a8e8) == 0) {
                        lVar3 = *(long *)(*(long *)&pGVar2[2].numPrimitives +
                                         (long)*(int *)(local_a880 + local_a8c0 * 4) * 0x38);
                        lVar4 = *(long *)(*(long *)&pGVar2[2].numPrimitives + 0x38 +
                                         (long)*(int *)(local_a880 + local_a8c0 * 4) * 0x38);
                        uVar60 = (ulong)*(uint *)(lVar50 + uVar51 * 4);
                        uVar61 = (ulong)*(uint *)(lVar50 + 0x10 + uVar51 * 4);
                        auVar75 = vsubps_avx512f(auVar68,auVar70);
                        uVar57 = *(undefined4 *)(lVar4 + uVar60 * 4);
                        auVar25._4_4_ = uVar57;
                        auVar25._0_4_ = uVar57;
                        auVar25._8_4_ = uVar57;
                        auVar25._12_4_ = uVar57;
                        auVar25._16_4_ = uVar57;
                        auVar25._20_4_ = uVar57;
                        auVar25._24_4_ = uVar57;
                        auVar25._28_4_ = uVar57;
                        auVar25._32_4_ = uVar57;
                        auVar25._36_4_ = uVar57;
                        auVar25._40_4_ = uVar57;
                        auVar25._44_4_ = uVar57;
                        auVar25._48_4_ = uVar57;
                        auVar25._52_4_ = uVar57;
                        auVar25._56_4_ = uVar57;
                        auVar25._60_4_ = uVar57;
                        auVar64 = vmulps_avx512f(auVar70,auVar25);
                        uVar57 = *(undefined4 *)(lVar4 + 4 + uVar60 * 4);
                        auVar26._4_4_ = uVar57;
                        auVar26._0_4_ = uVar57;
                        auVar26._8_4_ = uVar57;
                        auVar26._12_4_ = uVar57;
                        auVar26._16_4_ = uVar57;
                        auVar26._20_4_ = uVar57;
                        auVar26._24_4_ = uVar57;
                        auVar26._28_4_ = uVar57;
                        auVar26._32_4_ = uVar57;
                        auVar26._36_4_ = uVar57;
                        auVar26._40_4_ = uVar57;
                        auVar26._44_4_ = uVar57;
                        auVar26._48_4_ = uVar57;
                        auVar26._52_4_ = uVar57;
                        auVar26._56_4_ = uVar57;
                        auVar26._60_4_ = uVar57;
                        auVar76 = vmulps_avx512f(auVar70,auVar26);
                        uVar57 = *(undefined4 *)(lVar4 + 8 + uVar60 * 4);
                        auVar27._4_4_ = uVar57;
                        auVar27._0_4_ = uVar57;
                        auVar27._8_4_ = uVar57;
                        auVar27._12_4_ = uVar57;
                        auVar27._16_4_ = uVar57;
                        auVar27._20_4_ = uVar57;
                        auVar27._24_4_ = uVar57;
                        auVar27._28_4_ = uVar57;
                        auVar27._32_4_ = uVar57;
                        auVar27._36_4_ = uVar57;
                        auVar27._40_4_ = uVar57;
                        auVar27._44_4_ = uVar57;
                        auVar27._48_4_ = uVar57;
                        auVar27._52_4_ = uVar57;
                        auVar27._56_4_ = uVar57;
                        auVar27._60_4_ = uVar57;
                        auVar78 = vmulps_avx512f(auVar70,auVar27);
                        uVar57 = *(undefined4 *)(lVar3 + uVar60 * 4);
                        auVar28._4_4_ = uVar57;
                        auVar28._0_4_ = uVar57;
                        auVar28._8_4_ = uVar57;
                        auVar28._12_4_ = uVar57;
                        auVar28._16_4_ = uVar57;
                        auVar28._20_4_ = uVar57;
                        auVar28._24_4_ = uVar57;
                        auVar28._28_4_ = uVar57;
                        auVar28._32_4_ = uVar57;
                        auVar28._36_4_ = uVar57;
                        auVar28._40_4_ = uVar57;
                        auVar28._44_4_ = uVar57;
                        auVar28._48_4_ = uVar57;
                        auVar28._52_4_ = uVar57;
                        auVar28._56_4_ = uVar57;
                        auVar28._60_4_ = uVar57;
                        auVar79 = vfmadd231ps_avx512f(auVar64,auVar75,auVar28);
                        uVar57 = *(undefined4 *)(lVar3 + 4 + uVar60 * 4);
                        auVar29._4_4_ = uVar57;
                        auVar29._0_4_ = uVar57;
                        auVar29._8_4_ = uVar57;
                        auVar29._12_4_ = uVar57;
                        auVar29._16_4_ = uVar57;
                        auVar29._20_4_ = uVar57;
                        auVar29._24_4_ = uVar57;
                        auVar29._28_4_ = uVar57;
                        auVar29._32_4_ = uVar57;
                        auVar29._36_4_ = uVar57;
                        auVar29._40_4_ = uVar57;
                        auVar29._44_4_ = uVar57;
                        auVar29._48_4_ = uVar57;
                        auVar29._52_4_ = uVar57;
                        auVar29._56_4_ = uVar57;
                        auVar29._60_4_ = uVar57;
                        auVar71 = vfmadd231ps_avx512f(auVar76,auVar75,auVar29);
                        uVar57 = *(undefined4 *)(lVar3 + 8 + uVar60 * 4);
                        auVar30._4_4_ = uVar57;
                        auVar30._0_4_ = uVar57;
                        auVar30._8_4_ = uVar57;
                        auVar30._12_4_ = uVar57;
                        auVar30._16_4_ = uVar57;
                        auVar30._20_4_ = uVar57;
                        auVar30._24_4_ = uVar57;
                        auVar30._28_4_ = uVar57;
                        auVar30._32_4_ = uVar57;
                        auVar30._36_4_ = uVar57;
                        auVar30._40_4_ = uVar57;
                        auVar30._44_4_ = uVar57;
                        auVar30._48_4_ = uVar57;
                        auVar30._52_4_ = uVar57;
                        auVar30._56_4_ = uVar57;
                        auVar30._60_4_ = uVar57;
                        auVar72 = vfmadd231ps_avx512f(auVar78,auVar75,auVar30);
                        uVar57 = *(undefined4 *)(lVar4 + uVar61 * 4);
                        auVar31._4_4_ = uVar57;
                        auVar31._0_4_ = uVar57;
                        auVar31._8_4_ = uVar57;
                        auVar31._12_4_ = uVar57;
                        auVar31._16_4_ = uVar57;
                        auVar31._20_4_ = uVar57;
                        auVar31._24_4_ = uVar57;
                        auVar31._28_4_ = uVar57;
                        auVar31._32_4_ = uVar57;
                        auVar31._36_4_ = uVar57;
                        auVar31._40_4_ = uVar57;
                        auVar31._44_4_ = uVar57;
                        auVar31._48_4_ = uVar57;
                        auVar31._52_4_ = uVar57;
                        auVar31._56_4_ = uVar57;
                        auVar31._60_4_ = uVar57;
                        auVar64 = vmulps_avx512f(auVar70,auVar31);
                        uVar57 = *(undefined4 *)(lVar4 + 4 + uVar61 * 4);
                        auVar32._4_4_ = uVar57;
                        auVar32._0_4_ = uVar57;
                        auVar32._8_4_ = uVar57;
                        auVar32._12_4_ = uVar57;
                        auVar32._16_4_ = uVar57;
                        auVar32._20_4_ = uVar57;
                        auVar32._24_4_ = uVar57;
                        auVar32._28_4_ = uVar57;
                        auVar32._32_4_ = uVar57;
                        auVar32._36_4_ = uVar57;
                        auVar32._40_4_ = uVar57;
                        auVar32._44_4_ = uVar57;
                        auVar32._48_4_ = uVar57;
                        auVar32._52_4_ = uVar57;
                        auVar32._56_4_ = uVar57;
                        auVar32._60_4_ = uVar57;
                        auVar76 = vmulps_avx512f(auVar70,auVar32);
                        uVar57 = *(undefined4 *)(lVar4 + 8 + uVar61 * 4);
                        auVar33._4_4_ = uVar57;
                        auVar33._0_4_ = uVar57;
                        auVar33._8_4_ = uVar57;
                        auVar33._12_4_ = uVar57;
                        auVar33._16_4_ = uVar57;
                        auVar33._20_4_ = uVar57;
                        auVar33._24_4_ = uVar57;
                        auVar33._28_4_ = uVar57;
                        auVar33._32_4_ = uVar57;
                        auVar33._36_4_ = uVar57;
                        auVar33._40_4_ = uVar57;
                        auVar33._44_4_ = uVar57;
                        auVar33._48_4_ = uVar57;
                        auVar33._52_4_ = uVar57;
                        auVar33._56_4_ = uVar57;
                        auVar33._60_4_ = uVar57;
                        auVar78 = vmulps_avx512f(auVar70,auVar33);
                        uVar57 = *(undefined4 *)(lVar3 + uVar61 * 4);
                        auVar34._4_4_ = uVar57;
                        auVar34._0_4_ = uVar57;
                        auVar34._8_4_ = uVar57;
                        auVar34._12_4_ = uVar57;
                        auVar34._16_4_ = uVar57;
                        auVar34._20_4_ = uVar57;
                        auVar34._24_4_ = uVar57;
                        auVar34._28_4_ = uVar57;
                        auVar34._32_4_ = uVar57;
                        auVar34._36_4_ = uVar57;
                        auVar34._40_4_ = uVar57;
                        auVar34._44_4_ = uVar57;
                        auVar34._48_4_ = uVar57;
                        auVar34._52_4_ = uVar57;
                        auVar34._56_4_ = uVar57;
                        auVar34._60_4_ = uVar57;
                        auVar64 = vfmadd231ps_avx512f(auVar64,auVar75,auVar34);
                        uVar57 = *(undefined4 *)(lVar3 + 4 + uVar61 * 4);
                        auVar35._4_4_ = uVar57;
                        auVar35._0_4_ = uVar57;
                        auVar35._8_4_ = uVar57;
                        auVar35._12_4_ = uVar57;
                        auVar35._16_4_ = uVar57;
                        auVar35._20_4_ = uVar57;
                        auVar35._24_4_ = uVar57;
                        auVar35._28_4_ = uVar57;
                        auVar35._32_4_ = uVar57;
                        auVar35._36_4_ = uVar57;
                        auVar35._40_4_ = uVar57;
                        auVar35._44_4_ = uVar57;
                        auVar35._48_4_ = uVar57;
                        auVar35._52_4_ = uVar57;
                        auVar35._56_4_ = uVar57;
                        auVar35._60_4_ = uVar57;
                        auVar73 = vfmadd231ps_avx512f(auVar76,auVar75,auVar35);
                        uVar57 = *(undefined4 *)(lVar3 + 8 + uVar61 * 4);
                        auVar36._4_4_ = uVar57;
                        auVar36._0_4_ = uVar57;
                        auVar36._8_4_ = uVar57;
                        auVar36._12_4_ = uVar57;
                        auVar36._16_4_ = uVar57;
                        auVar36._20_4_ = uVar57;
                        auVar36._24_4_ = uVar57;
                        auVar36._28_4_ = uVar57;
                        auVar36._32_4_ = uVar57;
                        auVar36._36_4_ = uVar57;
                        auVar36._40_4_ = uVar57;
                        auVar36._44_4_ = uVar57;
                        auVar36._48_4_ = uVar57;
                        auVar36._52_4_ = uVar57;
                        auVar36._56_4_ = uVar57;
                        auVar36._60_4_ = uVar57;
                        auVar74 = vfmadd231ps_avx512f(auVar78,auVar75,auVar36);
                        uVar60 = (ulong)*(uint *)(lVar50 + 0x20 + uVar51 * 4);
                        uVar57 = *(undefined4 *)(lVar4 + uVar60 * 4);
                        auVar37._4_4_ = uVar57;
                        auVar37._0_4_ = uVar57;
                        auVar37._8_4_ = uVar57;
                        auVar37._12_4_ = uVar57;
                        auVar37._16_4_ = uVar57;
                        auVar37._20_4_ = uVar57;
                        auVar37._24_4_ = uVar57;
                        auVar37._28_4_ = uVar57;
                        auVar37._32_4_ = uVar57;
                        auVar37._36_4_ = uVar57;
                        auVar37._40_4_ = uVar57;
                        auVar37._44_4_ = uVar57;
                        auVar37._48_4_ = uVar57;
                        auVar37._52_4_ = uVar57;
                        auVar37._56_4_ = uVar57;
                        auVar37._60_4_ = uVar57;
                        auVar76 = vmulps_avx512f(auVar70,auVar37);
                        uVar57 = *(undefined4 *)(lVar4 + 4 + uVar60 * 4);
                        auVar38._4_4_ = uVar57;
                        auVar38._0_4_ = uVar57;
                        auVar38._8_4_ = uVar57;
                        auVar38._12_4_ = uVar57;
                        auVar38._16_4_ = uVar57;
                        auVar38._20_4_ = uVar57;
                        auVar38._24_4_ = uVar57;
                        auVar38._28_4_ = uVar57;
                        auVar38._32_4_ = uVar57;
                        auVar38._36_4_ = uVar57;
                        auVar38._40_4_ = uVar57;
                        auVar38._44_4_ = uVar57;
                        auVar38._48_4_ = uVar57;
                        auVar38._52_4_ = uVar57;
                        auVar38._56_4_ = uVar57;
                        auVar38._60_4_ = uVar57;
                        auVar78 = vmulps_avx512f(auVar70,auVar38);
                        uVar57 = *(undefined4 *)(lVar4 + 8 + uVar60 * 4);
                        auVar39._4_4_ = uVar57;
                        auVar39._0_4_ = uVar57;
                        auVar39._8_4_ = uVar57;
                        auVar39._12_4_ = uVar57;
                        auVar39._16_4_ = uVar57;
                        auVar39._20_4_ = uVar57;
                        auVar39._24_4_ = uVar57;
                        auVar39._28_4_ = uVar57;
                        auVar39._32_4_ = uVar57;
                        auVar39._36_4_ = uVar57;
                        auVar39._40_4_ = uVar57;
                        auVar39._44_4_ = uVar57;
                        auVar39._48_4_ = uVar57;
                        auVar39._52_4_ = uVar57;
                        auVar39._56_4_ = uVar57;
                        auVar39._60_4_ = uVar57;
                        auVar70 = vmulps_avx512f(auVar70,auVar39);
                        uVar57 = *(undefined4 *)(lVar3 + uVar60 * 4);
                        auVar40._4_4_ = uVar57;
                        auVar40._0_4_ = uVar57;
                        auVar40._8_4_ = uVar57;
                        auVar40._12_4_ = uVar57;
                        auVar40._16_4_ = uVar57;
                        auVar40._20_4_ = uVar57;
                        auVar40._24_4_ = uVar57;
                        auVar40._28_4_ = uVar57;
                        auVar40._32_4_ = uVar57;
                        auVar40._36_4_ = uVar57;
                        auVar40._40_4_ = uVar57;
                        auVar40._44_4_ = uVar57;
                        auVar40._48_4_ = uVar57;
                        auVar40._52_4_ = uVar57;
                        auVar40._56_4_ = uVar57;
                        auVar40._60_4_ = uVar57;
                        auVar76 = vfmadd231ps_avx512f(auVar76,auVar75,auVar40);
                        uVar57 = *(undefined4 *)(lVar3 + 4 + uVar60 * 4);
                        auVar41._4_4_ = uVar57;
                        auVar41._0_4_ = uVar57;
                        auVar41._8_4_ = uVar57;
                        auVar41._12_4_ = uVar57;
                        auVar41._16_4_ = uVar57;
                        auVar41._20_4_ = uVar57;
                        auVar41._24_4_ = uVar57;
                        auVar41._28_4_ = uVar57;
                        auVar41._32_4_ = uVar57;
                        auVar41._36_4_ = uVar57;
                        auVar41._40_4_ = uVar57;
                        auVar41._44_4_ = uVar57;
                        auVar41._48_4_ = uVar57;
                        auVar41._52_4_ = uVar57;
                        auVar41._56_4_ = uVar57;
                        auVar41._60_4_ = uVar57;
                        auVar78 = vfmadd231ps_avx512f(auVar78,auVar75,auVar41);
                        uVar57 = *(undefined4 *)(lVar3 + 8 + uVar60 * 4);
                        auVar42._4_4_ = uVar57;
                        auVar42._0_4_ = uVar57;
                        auVar42._8_4_ = uVar57;
                        auVar42._12_4_ = uVar57;
                        auVar42._16_4_ = uVar57;
                        auVar42._20_4_ = uVar57;
                        auVar42._24_4_ = uVar57;
                        auVar42._28_4_ = uVar57;
                        auVar42._32_4_ = uVar57;
                        auVar42._36_4_ = uVar57;
                        auVar42._40_4_ = uVar57;
                        auVar42._44_4_ = uVar57;
                        auVar42._48_4_ = uVar57;
                        auVar42._52_4_ = uVar57;
                        auVar42._56_4_ = uVar57;
                        auVar42._60_4_ = uVar57;
                        auVar70 = vfmadd231ps_avx512f(auVar70,auVar75,auVar42);
                      }
                      else {
                        if ((ushort)local_a8e8 != 0) {
                          lVar3 = *(long *)&pGVar2[2].numPrimitives;
                          uVar53 = (ulong)*(uint *)(lVar50 + uVar51 * 4);
                          uVar61 = local_a8b8;
                          uVar60 = local_a8c0;
                          do {
                            auVar63 = *(undefined1 (*) [16])
                                       (*(long *)(lVar3 + (long)*(int *)(local_a880 + uVar60 * 4) *
                                                          0x38) + uVar53 * 4);
                            auVar102 = *(undefined1 (*) [16])
                                        (*(long *)(lVar3 + 0x38 +
                                                  (long)*(int *)(local_a880 + uVar60 * 4) * 0x38) +
                                        uVar53 * 4);
                            *(int *)((long)&local_a700 + uVar60 * 4) = auVar63._0_4_;
                            uVar57 = vextractps_avx(auVar63,1);
                            *(undefined4 *)((long)&local_a6c0 + uVar60 * 4) = uVar57;
                            uVar57 = vextractps_avx(auVar63,2);
                            *(undefined4 *)((long)&local_a680 + uVar60 * 4) = uVar57;
                            *(int *)((long)&local_a7c0 + uVar60 * 4) = auVar102._0_4_;
                            uVar57 = vextractps_avx(auVar102,1);
                            *(undefined4 *)(local_a780 + uVar60 * 4) = uVar57;
                            uVar57 = vextractps_avx(auVar102,2);
                            *(undefined4 *)(local_a740 + uVar60 * 4) = uVar57;
                            uVar61 = uVar61 ^ 1L << (uVar60 & 0x3f);
                            uVar60 = 0;
                            for (uVar22 = uVar61; (uVar22 & 1) == 0;
                                uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                              uVar60 = uVar60 + 1;
                            }
                          } while (uVar61 != 0);
                          auVar104._8_8_ = uStack_a6f8;
                          auVar104._0_8_ = local_a700;
                          auVar104._16_8_ = uStack_a6f0;
                          auVar104._24_8_ = uStack_a6e8;
                          auVar104._32_8_ = uStack_a6e0;
                          auVar104._40_8_ = uStack_a6d8;
                          auVar104._48_8_ = uStack_a6d0;
                          auVar104._56_8_ = uStack_a6c8;
                          aVar77 = local_a7c0;
                        }
                        auVar76 = vsubps_avx512f(auVar68,auVar70);
                        auVar85._8_8_ = uStack_a6b8;
                        auVar85._0_8_ = local_a6c0;
                        auVar85._16_8_ = uStack_a6b0;
                        auVar85._24_8_ = uStack_a6a8;
                        auVar85._32_8_ = uStack_a6a0;
                        auVar85._40_8_ = uStack_a698;
                        auVar85._48_8_ = uStack_a690;
                        auVar85._56_8_ = uStack_a688;
                        auVar71 = vmulps_avx512f(auVar76,auVar85);
                        auVar46._8_8_ = uStack_a678;
                        auVar46._0_8_ = local_a680;
                        auVar46._16_8_ = uStack_a670;
                        auVar46._24_8_ = uStack_a668;
                        auVar46._32_8_ = uStack_a660;
                        auVar46._40_8_ = uStack_a658;
                        auVar46._48_8_ = uStack_a650;
                        auVar46._56_8_ = uStack_a648;
                        auVar72 = vmulps_avx512f(auVar76,auVar46);
                        auVar73 = vmulps_avx512f(auVar70,local_a780);
                        auVar74 = vmulps_avx512f(auVar70,local_a740);
                        if ((ushort)local_a8e8 != 0) {
                          lVar3 = *(long *)&pGVar2[2].numPrimitives;
                          uVar53 = (ulong)*(uint *)(lVar50 + 0x10 + uVar51 * 4);
                          uVar61 = local_a8b8;
                          uVar60 = local_a8c0;
                          do {
                            auVar63 = *(undefined1 (*) [16])
                                       (*(long *)(lVar3 + (long)*(int *)(local_a880 + uVar60 * 4) *
                                                          0x38) + uVar53 * 4);
                            auVar102 = *(undefined1 (*) [16])
                                        (*(long *)(lVar3 + 0x38 +
                                                  (long)*(int *)(local_a880 + uVar60 * 4) * 0x38) +
                                        uVar53 * 4);
                            *(int *)((long)&local_a700 + uVar60 * 4) = auVar63._0_4_;
                            uVar57 = vextractps_avx(auVar63,1);
                            *(undefined4 *)((long)&local_a6c0 + uVar60 * 4) = uVar57;
                            uVar57 = vextractps_avx(auVar63,2);
                            *(undefined4 *)((long)&local_a680 + uVar60 * 4) = uVar57;
                            *(int *)((long)&local_a7c0 + uVar60 * 4) = auVar102._0_4_;
                            uVar57 = vextractps_avx(auVar102,1);
                            *(undefined4 *)(local_a780 + uVar60 * 4) = uVar57;
                            uVar57 = vextractps_avx(auVar102,2);
                            *(undefined4 *)(local_a740 + uVar60 * 4) = uVar57;
                            uVar61 = uVar61 ^ 1L << (uVar60 & 0x3f);
                            uVar60 = 0;
                            for (uVar22 = uVar61; (uVar22 & 1) == 0;
                                uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                              uVar60 = uVar60 + 1;
                            }
                          } while (uVar61 != 0);
                          auVar64._8_8_ = uStack_a6f8;
                          auVar64._0_8_ = local_a700;
                          auVar64._16_8_ = uStack_a6f0;
                          auVar64._24_8_ = uStack_a6e8;
                          auVar64._32_8_ = uStack_a6e0;
                          auVar64._40_8_ = uStack_a6d8;
                          auVar64._48_8_ = uStack_a6d0;
                          auVar64._56_8_ = uStack_a6c8;
                          aVar69 = local_a7c0;
                        }
                        auVar44._8_8_ = uStack_a6b8;
                        auVar44._0_8_ = local_a6c0;
                        auVar44._16_8_ = uStack_a6b0;
                        auVar44._24_8_ = uStack_a6a8;
                        auVar44._32_8_ = uStack_a6a0;
                        auVar44._40_8_ = uStack_a698;
                        auVar44._48_8_ = uStack_a690;
                        auVar44._56_8_ = uStack_a688;
                        auVar75 = vmulps_avx512f(auVar76,auVar44);
                        auVar47._8_8_ = uStack_a678;
                        auVar47._0_8_ = local_a680;
                        auVar47._16_8_ = uStack_a670;
                        auVar47._24_8_ = uStack_a668;
                        auVar47._32_8_ = uStack_a660;
                        auVar47._40_8_ = uStack_a658;
                        auVar47._48_8_ = uStack_a650;
                        auVar47._56_8_ = uStack_a648;
                        auVar80 = vmulps_avx512f(auVar76,auVar47);
                        auVar81 = vmulps_avx512f(auVar70,local_a780);
                        auVar82 = vmulps_avx512f(auVar70,local_a740);
                        if ((ushort)local_a8e8 != 0) {
                          lVar3 = *(long *)&pGVar2[2].numPrimitives;
                          uVar53 = (ulong)*(uint *)(lVar50 + 0x20 + uVar51 * 4);
                          uVar61 = local_a8b8;
                          uVar60 = local_a8c0;
                          do {
                            auVar63 = *(undefined1 (*) [16])
                                       (*(long *)(lVar3 + (long)*(int *)(local_a880 + uVar60 * 4) *
                                                          0x38) + uVar53 * 4);
                            auVar102 = *(undefined1 (*) [16])
                                        (*(long *)(lVar3 + 0x38 +
                                                  (long)*(int *)(local_a880 + uVar60 * 4) * 0x38) +
                                        uVar53 * 4);
                            *(int *)((long)&local_a700 + uVar60 * 4) = auVar63._0_4_;
                            uVar57 = vextractps_avx(auVar63,1);
                            *(undefined4 *)((long)&local_a6c0 + uVar60 * 4) = uVar57;
                            uVar57 = vextractps_avx(auVar63,2);
                            *(undefined4 *)((long)&local_a680 + uVar60 * 4) = uVar57;
                            *(int *)((long)&local_a7c0 + uVar60 * 4) = auVar102._0_4_;
                            uVar57 = vextractps_avx(auVar102,1);
                            *(undefined4 *)(local_a780 + uVar60 * 4) = uVar57;
                            uVar57 = vextractps_avx(auVar102,2);
                            *(undefined4 *)(local_a740 + uVar60 * 4) = uVar57;
                            uVar61 = uVar61 ^ 1L << (uVar60 & 0x3f);
                            uVar60 = 0;
                            for (uVar22 = uVar61; (uVar22 & 1) == 0;
                                uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                              uVar60 = uVar60 + 1;
                            }
                          } while (uVar61 != 0);
                          auVar78._8_8_ = uStack_a6f8;
                          auVar78._0_8_ = local_a700;
                          auVar78._16_8_ = uStack_a6f0;
                          auVar78._24_8_ = uStack_a6e8;
                          auVar78._32_8_ = uStack_a6e0;
                          auVar78._40_8_ = uStack_a6d8;
                          auVar78._48_8_ = uStack_a6d0;
                          auVar78._56_8_ = uStack_a6c8;
                          in_ZMM14 = local_a7c0;
                        }
                        auVar79 = vmulps_avx512f(auVar76,auVar104);
                        auVar83 = vmulps_avx512f(auVar70,(undefined1  [64])aVar77);
                        auVar79 = vaddps_avx512f(auVar79,auVar83);
                        auVar71 = vaddps_avx512f(auVar71,auVar73);
                        auVar72 = vaddps_avx512f(auVar72,auVar74);
                        auVar64 = vmulps_avx512f(auVar76,auVar64);
                        auVar73 = vmulps_avx512f(auVar70,(undefined1  [64])aVar69);
                        auVar64 = vaddps_avx512f(auVar64,auVar73);
                        auVar73 = vaddps_avx512f(auVar75,auVar81);
                        auVar74 = vaddps_avx512f(auVar80,auVar82);
                        auVar78 = vmulps_avx512f(auVar76,auVar78);
                        auVar45._8_8_ = uStack_a6b8;
                        auVar45._0_8_ = local_a6c0;
                        auVar45._16_8_ = uStack_a6b0;
                        auVar45._24_8_ = uStack_a6a8;
                        auVar45._32_8_ = uStack_a6a0;
                        auVar45._40_8_ = uStack_a698;
                        auVar45._48_8_ = uStack_a690;
                        auVar45._56_8_ = uStack_a688;
                        auVar75 = vmulps_avx512f(auVar76,auVar45);
                        auVar48._8_8_ = uStack_a678;
                        auVar48._0_8_ = local_a680;
                        auVar48._16_8_ = uStack_a670;
                        auVar48._24_8_ = uStack_a668;
                        auVar48._32_8_ = uStack_a660;
                        auVar48._40_8_ = uStack_a658;
                        auVar48._48_8_ = uStack_a650;
                        auVar48._56_8_ = uStack_a648;
                        auVar80 = vmulps_avx512f(auVar76,auVar48);
                        auVar76 = vmulps_avx512f(auVar70,(undefined1  [64])in_ZMM14);
                        auVar76 = vaddps_avx512f(auVar78,auVar76);
                        auVar78 = vmulps_avx512f(auVar70,local_a780);
                        auVar78 = vaddps_avx512f(auVar75,auVar78);
                        auVar70 = vmulps_avx512f(auVar70,local_a740);
                        auVar70 = vaddps_avx512f(auVar80,auVar70);
                      }
                      local_a7d0 = *(undefined8 *)(lVar50 + 0x30);
                      uStack_a7c8 = *(undefined8 *)(lVar50 + 0x38);
                      local_a7e0 = *(undefined8 *)(lVar50 + 0x40);
                      uStack_a7d8 = *(undefined8 *)(lVar50 + 0x48);
                      aVar69 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)
                               vsubps_avx512f(auVar79,auVar64);
                      auVar64 = vsubps_avx512f(auVar71,auVar73);
                      auVar73 = vsubps_avx512f(auVar72,auVar74);
                      auVar74 = vsubps_avx512f(auVar76,auVar79);
                      auVar78 = vsubps_avx512f(auVar78,auVar71);
                      auVar75 = vsubps_avx512f(auVar70,auVar72);
                      auVar76 = vmulps_avx512f(auVar64,auVar75);
                      auVar80 = vfmsub231ps_avx512f(auVar76,auVar78,auVar73);
                      auVar76 = vmulps_avx512f(auVar73,auVar74);
                      auVar81 = vfmsub231ps_avx512f(auVar76,auVar75,(undefined1  [64])aVar69);
                      auVar82 = vmulps_avx512f((undefined1  [64])aVar69,auVar78);
                      auVar79 = vsubps_avx512f(auVar79,*(undefined1 (*) [64])ray);
                      auVar83 = vsubps_avx512f(auVar71,*(undefined1 (*) [64])(ray + 0x40));
                      auVar72 = vsubps_avx512f(auVar72,*(undefined1 (*) [64])(ray + 0x80));
                      auVar76 = *(undefined1 (*) [64])(ray + 0x100);
                      auVar70 = *(undefined1 (*) [64])(ray + 0x140);
                      auVar71 = *(undefined1 (*) [64])(ray + 0x180);
                      auVar82 = vfmsub231ps_avx512f(auVar82,auVar74,auVar64);
                      auVar84 = vmulps_avx512f(auVar70,auVar72);
                      auVar84 = vfmsub231ps_avx512f(auVar84,auVar83,auVar71);
                      auVar104 = vmulps_avx512f(auVar71,auVar79);
                      auVar104 = vfmsub231ps_avx512f(auVar104,auVar72,auVar76);
                      auVar85 = vmulps_avx512f(auVar76,auVar83);
                      in_ZMM14 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)
                                 vfmsub231ps_avx512f(auVar85,auVar79,auVar70);
                      auVar71 = vmulps_avx512f(auVar82,auVar71);
                      auVar70 = vfmadd231ps_avx512f(auVar71,auVar81,auVar70);
                      auVar76 = vfmadd231ps_avx512f(auVar70,auVar80,auVar76);
                      auVar70 = vandps_avx512dq(auVar76,auVar103);
                      auVar71 = vmulps_avx512f(auVar75,(undefined1  [64])in_ZMM14);
                      auVar71 = vfmadd231ps_avx512f(auVar71,auVar104,auVar78);
                      auVar71 = vfmadd231ps_avx512f(auVar71,auVar84,auVar74);
                      auVar71 = vxorps_avx512dq(auVar70,auVar71);
                      uVar23 = vcmpps_avx512f(auVar71,auVar65,5);
                      uVar49 = (ushort)uVar23 & uVar49;
                      if (uVar49 == 0) {
LAB_01f61dba:
                        uVar49 = 0;
                      }
                      else {
                        auVar73 = vmulps_avx512f(auVar73,(undefined1  [64])in_ZMM14);
                        auVar73 = vfmadd213ps_avx512f(auVar104,auVar64,auVar73);
                        auVar73 = vfmadd213ps_avx512f(auVar84,(undefined1  [64])aVar69,auVar73);
                        aVar69 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)
                                 vxorps_avx512dq(auVar70,auVar73);
                        uVar23 = vcmpps_avx512f((undefined1  [64])aVar69,auVar65,5);
                        uVar49 = uVar49 & (ushort)uVar23;
                        if (uVar49 == 0) goto LAB_01f61dba;
                        auVar43._8_4_ = 0x7fffffff;
                        auVar43._0_8_ = 0x7fffffff7fffffff;
                        auVar43._12_4_ = 0x7fffffff;
                        auVar43._16_4_ = 0x7fffffff;
                        auVar43._20_4_ = 0x7fffffff;
                        auVar43._24_4_ = 0x7fffffff;
                        auVar43._28_4_ = 0x7fffffff;
                        auVar43._32_4_ = 0x7fffffff;
                        auVar43._36_4_ = 0x7fffffff;
                        auVar43._40_4_ = 0x7fffffff;
                        auVar43._44_4_ = 0x7fffffff;
                        auVar43._48_4_ = 0x7fffffff;
                        auVar43._52_4_ = 0x7fffffff;
                        auVar43._56_4_ = 0x7fffffff;
                        auVar43._60_4_ = 0x7fffffff;
                        auVar64 = vandpd_avx512dq(auVar76,auVar43);
                        auVar73 = vsubps_avx512f(auVar64,auVar71);
                        uVar23 = vcmpps_avx512f(auVar73,(undefined1  [64])aVar69,5);
                        uVar49 = uVar49 & (ushort)uVar23;
                        if (uVar49 == 0) goto LAB_01f61dba;
                        auVar103 = vmulps_avx512f(auVar82,auVar72);
                        auVar103 = vfmadd213ps_avx512f(auVar83,auVar81,auVar103);
                        auVar103 = vfmadd213ps_avx512f(auVar79,auVar80,auVar103);
                        auVar103 = vxorps_avx512dq(auVar70,auVar103);
                        auVar66 = vmulps_avx512f(auVar64,*(undefined1 (*) [64])(ray + 0xc0));
                        auVar70 = vmulps_avx512f(auVar64,*(undefined1 (*) [64])(ray + 0x200));
                        uVar23 = vcmpps_avx512f(auVar103,auVar70,2);
                        uVar24 = vcmpps_avx512f(auVar66,auVar103,1);
                        uVar49 = uVar49 & (ushort)uVar23 & (ushort)uVar24;
                        if (uVar49 == 0) {
LAB_01f62523:
                          uVar49 = 0;
                        }
                        else {
                          uVar23 = vcmpps_avx512f(auVar76,ZEXT1664(ZEXT816(0) << 0x40),4);
                          uVar49 = uVar49 & (ushort)uVar23;
                          if (uVar49 == 0) goto LAB_01f62523;
                          local_9ec0 = auVar71;
                          local_9f00 = aVar69;
                          local_9f40 = auVar103;
                          local_9f80 = auVar64;
                          local_9fc0 = auVar80;
                          local_a000 = auVar81;
                          local_a040 = auVar82;
                        }
                        auVar66 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                        auVar63 = vxorps_avx512vl(auVar65._0_16_,auVar65._0_16_);
                        auVar65 = ZEXT1664(auVar63);
                        auVar103 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
                      }
                      auVar63 = auVar65._0_16_;
                      pGVar2 = pRVar1[*(uint *)((long)&local_a7d0 + uVar51 * 4)].ptr;
                      auVar76 = vpbroadcastd_avx512f(ZEXT416(pGVar2->mask));
                      uVar23 = vptestmd_avx512f(auVar76,*(undefined1 (*) [64])(ray + 0x240));
                      uVar49 = (ushort)uVar23 & uVar49;
                      if (uVar49 != 0) {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar76 = vrcp14ps_avx512f(local_9f80);
                          auVar70 = vfnmadd213ps_avx512f(auVar76,local_9f80,auVar68);
                          auVar76 = vfmadd132ps_avx512f(auVar70,auVar76,auVar76);
                          local_a640 = vmulps_avx512f(auVar76,local_9ec0);
                          local_a600 = vmulps_avx512f(auVar76,(undefined1  [64])local_9f00);
                          auVar70 = vpbroadcastd_avx512f();
                          auVar71 = vpbroadcastd_avx512f();
                          local_a700 = local_9fc0._0_8_;
                          uStack_a6f8 = local_9fc0._8_8_;
                          uStack_a6f0 = local_9fc0._16_8_;
                          uStack_a6e8 = local_9fc0._24_8_;
                          uStack_a6e0 = local_9fc0._32_8_;
                          uStack_a6d8 = local_9fc0._40_8_;
                          uStack_a6d0 = local_9fc0._48_8_;
                          uStack_a6c8 = local_9fc0._56_8_;
                          local_a6c0 = local_a000._0_8_;
                          uStack_a6b8 = local_a000._8_8_;
                          uStack_a6b0 = local_a000._16_8_;
                          uStack_a6a8 = local_a000._24_8_;
                          uStack_a6a0 = local_a000._32_8_;
                          uStack_a698 = local_a000._40_8_;
                          uStack_a690 = local_a000._48_8_;
                          uStack_a688 = local_a000._56_8_;
                          local_a680 = local_a040._0_8_;
                          uStack_a678 = local_a040._8_8_;
                          uStack_a670 = local_a040._16_8_;
                          uStack_a668 = local_a040._24_8_;
                          uStack_a660 = local_a040._32_8_;
                          uStack_a658 = local_a040._40_8_;
                          uStack_a650 = local_a040._48_8_;
                          uStack_a648 = local_a040._56_8_;
                          local_a5c0 = vmovdqa64_avx512f(auVar71);
                          local_a580 = vmovdqa64_avx512f(auVar70);
                          vpcmpeqd_avx2(local_a640._0_32_,local_a640._0_32_);
                          local_a540 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                          local_a500 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                          local_a4c0 = *(int *)(ray + 0x200);
                          iStack_a4bc = *(int *)(ray + 0x204);
                          iStack_a4b8 = *(int *)(ray + 0x208);
                          iStack_a4b4 = *(int *)(ray + 0x20c);
                          iStack_a4b0 = *(int *)(ray + 0x210);
                          iStack_a4ac = *(int *)(ray + 0x214);
                          iStack_a4a8 = *(int *)(ray + 0x218);
                          iStack_a4a4 = *(int *)(ray + 0x21c);
                          iStack_a4a0 = *(int *)(ray + 0x220);
                          iStack_a49c = *(int *)(ray + 0x224);
                          iStack_a498 = *(int *)(ray + 0x228);
                          iStack_a494 = *(int *)(ray + 0x22c);
                          iStack_a490 = *(int *)(ray + 0x230);
                          iStack_a48c = *(int *)(ray + 0x234);
                          iStack_a488 = *(int *)(ray + 0x238);
                          iStack_a484 = *(int *)(ray + 0x23c);
                          auVar76 = vmulps_avx512f(auVar76,local_9f40);
                          bVar59 = (bool)((byte)uVar49 & 1);
                          bVar6 = (bool)((byte)(uVar49 >> 1) & 1);
                          bVar7 = (bool)((byte)(uVar49 >> 2) & 1);
                          bVar8 = (bool)((byte)(uVar49 >> 3) & 1);
                          bVar9 = (bool)((byte)(uVar49 >> 4) & 1);
                          bVar10 = (bool)((byte)(uVar49 >> 5) & 1);
                          bVar11 = (bool)((byte)(uVar49 >> 6) & 1);
                          bVar12 = (bool)((byte)(uVar49 >> 7) & 1);
                          bVar13 = (byte)(uVar49 >> 8);
                          bVar14 = (bool)(bVar13 >> 1 & 1);
                          bVar15 = (bool)(bVar13 >> 2 & 1);
                          bVar16 = (bool)(bVar13 >> 3 & 1);
                          bVar17 = (bool)(bVar13 >> 4 & 1);
                          bVar18 = (bool)(bVar13 >> 5 & 1);
                          bVar19 = (bool)(bVar13 >> 6 & 1);
                          *(uint *)(ray + 0x200) =
                               (uint)bVar59 * auVar76._0_4_ | (uint)!bVar59 * local_a4c0;
                          *(uint *)(ray + 0x204) =
                               (uint)bVar6 * auVar76._4_4_ | (uint)!bVar6 * iStack_a4bc;
                          *(uint *)(ray + 0x208) =
                               (uint)bVar7 * auVar76._8_4_ | (uint)!bVar7 * iStack_a4b8;
                          *(uint *)(ray + 0x20c) =
                               (uint)bVar8 * auVar76._12_4_ | (uint)!bVar8 * iStack_a4b4;
                          *(uint *)(ray + 0x210) =
                               (uint)bVar9 * auVar76._16_4_ | (uint)!bVar9 * iStack_a4b0;
                          *(uint *)(ray + 0x214) =
                               (uint)bVar10 * auVar76._20_4_ | (uint)!bVar10 * iStack_a4ac;
                          *(uint *)(ray + 0x218) =
                               (uint)bVar11 * auVar76._24_4_ | (uint)!bVar11 * iStack_a4a8;
                          *(uint *)(ray + 0x21c) =
                               (uint)bVar12 * auVar76._28_4_ | (uint)!bVar12 * iStack_a4a4;
                          *(uint *)(ray + 0x220) =
                               (uint)(bVar13 & 1) * auVar76._32_4_ |
                               (uint)!(bool)(bVar13 & 1) * iStack_a4a0;
                          *(uint *)(ray + 0x224) =
                               (uint)bVar14 * auVar76._36_4_ | (uint)!bVar14 * iStack_a49c;
                          *(uint *)(ray + 0x228) =
                               (uint)bVar15 * auVar76._40_4_ | (uint)!bVar15 * iStack_a498;
                          *(uint *)(ray + 0x22c) =
                               (uint)bVar16 * auVar76._44_4_ | (uint)!bVar16 * iStack_a494;
                          *(uint *)(ray + 0x230) =
                               (uint)bVar17 * auVar76._48_4_ | (uint)!bVar17 * iStack_a490;
                          *(uint *)(ray + 0x234) =
                               (uint)bVar18 * auVar76._52_4_ | (uint)!bVar18 * iStack_a48c;
                          *(uint *)(ray + 0x238) =
                               (uint)bVar19 * auVar76._56_4_ | (uint)!bVar19 * iStack_a488;
                          *(uint *)(ray + 0x23c) =
                               (uint)(bVar13 >> 7) * auVar76._60_4_ |
                               (uint)!(bool)(bVar13 >> 7) * iStack_a484;
                          auVar76 = vpmovm2d_avx512dq((ulong)uVar49);
                          local_a7c0 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)
                                       vmovdqa64_avx512f(auVar76);
                          local_a880._8_8_ = pGVar2->userPtr;
                          local_a880._0_8_ = &local_a7c0;
                          pRStack_a870 = context->user;
                          pRStack_a868 = ray;
                          puStack_a860 = &local_a700;
                          auStack_a854 = auVar67._44_20_;
                          uStack_a858 = 0x10;
                          if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            aVar69 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)
                                     ZEXT1664(aVar69._0_16_);
                            auVar64 = ZEXT1664(auVar64._0_16_);
                            in_ZMM14 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)
                                       ZEXT1664(in_ZMM14._0_16_);
                            auVar78 = ZEXT1664(auVar78._0_16_);
                            (*pGVar2->occlusionFilterN)((RTCFilterFunctionNArguments *)local_a880);
                            auVar103 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
                            auVar63 = vxorps_avx512vl(auVar63,auVar63);
                            auVar65 = ZEXT1664(auVar63);
                            auVar66 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                            auVar68 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                            auVar76 = vmovdqa64_avx512f((undefined1  [64])local_a7c0);
                          }
                          auVar63 = auVar65._0_16_;
                          uVar23 = vptestmd_avx512f(auVar76,auVar76);
                          if ((short)uVar23 == 0) {
                            uVar60 = 0;
                          }
                          else {
                            p_Var5 = context->args->filter;
                            if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                              aVar69 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)
                                       ZEXT1664(aVar69._0_16_);
                              auVar64 = ZEXT1664(auVar64._0_16_);
                              in_ZMM14 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)
                                         ZEXT1664(in_ZMM14._0_16_);
                              auVar78 = ZEXT1664(auVar78._0_16_);
                              (*p_Var5)((RTCFilterFunctionNArguments *)local_a880);
                              auVar103 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
                              auVar63 = vxorps_avx512vl(auVar63,auVar63);
                              auVar65 = ZEXT1664(auVar63);
                              auVar66 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
                              auVar68 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
                              auVar76 = vmovdqa64_avx512f((undefined1  [64])local_a7c0);
                            }
                            uVar60 = vptestmd_avx512f(auVar76,auVar76);
                            auVar67 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                            bVar59 = (bool)((byte)uVar60 & 1);
                            auVar86._0_4_ =
                                 (uint)bVar59 * auVar67._0_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x200);
                            bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
                            auVar86._4_4_ =
                                 (uint)bVar59 * auVar67._4_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x204);
                            bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
                            auVar86._8_4_ =
                                 (uint)bVar59 * auVar67._8_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x208);
                            bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
                            auVar86._12_4_ =
                                 (uint)bVar59 * auVar67._12_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x20c);
                            bVar59 = (bool)((byte)(uVar60 >> 4) & 1);
                            auVar86._16_4_ =
                                 (uint)bVar59 * auVar67._16_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x210);
                            bVar59 = (bool)((byte)(uVar60 >> 5) & 1);
                            auVar86._20_4_ =
                                 (uint)bVar59 * auVar67._20_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x214);
                            bVar59 = (bool)((byte)(uVar60 >> 6) & 1);
                            auVar86._24_4_ =
                                 (uint)bVar59 * auVar67._24_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x218);
                            bVar59 = (bool)((byte)(uVar60 >> 7) & 1);
                            auVar86._28_4_ =
                                 (uint)bVar59 * auVar67._28_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x21c);
                            bVar59 = (bool)((byte)(uVar60 >> 8) & 1);
                            auVar86._32_4_ =
                                 (uint)bVar59 * auVar67._32_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x220);
                            bVar59 = (bool)((byte)(uVar60 >> 9) & 1);
                            auVar86._36_4_ =
                                 (uint)bVar59 * auVar67._36_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x224);
                            bVar59 = (bool)((byte)(uVar60 >> 10) & 1);
                            auVar86._40_4_ =
                                 (uint)bVar59 * auVar67._40_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x228);
                            bVar59 = (bool)((byte)(uVar60 >> 0xb) & 1);
                            auVar86._44_4_ =
                                 (uint)bVar59 * auVar67._44_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x22c);
                            bVar59 = (bool)((byte)(uVar60 >> 0xc) & 1);
                            auVar86._48_4_ =
                                 (uint)bVar59 * auVar67._48_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x230);
                            bVar59 = (bool)((byte)(uVar60 >> 0xd) & 1);
                            auVar86._52_4_ =
                                 (uint)bVar59 * auVar67._52_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x234);
                            bVar59 = (bool)((byte)(uVar60 >> 0xe) & 1);
                            auVar86._56_4_ =
                                 (uint)bVar59 * auVar67._56_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x238);
                            bVar59 = SUB81(uVar60 >> 0xf,0);
                            auVar86._60_4_ =
                                 (uint)bVar59 * auVar67._60_4_ |
                                 (uint)!bVar59 * *(int *)(pRStack_a868 + 0x23c);
                            *(undefined1 (*) [64])(pRStack_a868 + 0x200) = auVar86;
                          }
                          uVar49 = (ushort)uVar60;
                          bVar59 = (bool)((byte)uVar60 & 1);
                          bVar6 = (bool)((byte)(uVar60 >> 1) & 1);
                          bVar7 = (bool)((byte)(uVar60 >> 2) & 1);
                          bVar8 = (bool)((byte)(uVar60 >> 3) & 1);
                          bVar9 = (bool)((byte)(uVar60 >> 4) & 1);
                          bVar10 = (bool)((byte)(uVar60 >> 5) & 1);
                          bVar11 = (bool)((byte)(uVar60 >> 6) & 1);
                          bVar12 = (bool)((byte)(uVar60 >> 7) & 1);
                          bVar14 = (bool)((byte)(uVar60 >> 8) & 1);
                          bVar15 = (bool)((byte)(uVar60 >> 9) & 1);
                          bVar16 = (bool)((byte)(uVar60 >> 10) & 1);
                          bVar17 = (bool)((byte)(uVar60 >> 0xb) & 1);
                          bVar18 = (bool)((byte)(uVar60 >> 0xc) & 1);
                          bVar19 = (bool)((byte)(uVar60 >> 0xd) & 1);
                          bVar20 = (bool)((byte)(uVar60 >> 0xe) & 1);
                          bVar21 = SUB81(uVar60 >> 0xf,0);
                          *(uint *)local_a8a8 =
                               (uint)bVar59 * *(int *)local_a8a8 | (uint)!bVar59 * local_a4c0;
                          *(uint *)(local_a8a8 + 4) =
                               (uint)bVar6 * *(int *)(local_a8a8 + 4) | (uint)!bVar6 * iStack_a4bc;
                          *(uint *)(local_a8a8 + 8) =
                               (uint)bVar7 * *(int *)(local_a8a8 + 8) | (uint)!bVar7 * iStack_a4b8;
                          *(uint *)(local_a8a8 + 0xc) =
                               (uint)bVar8 * *(int *)(local_a8a8 + 0xc) | (uint)!bVar8 * iStack_a4b4
                          ;
                          *(uint *)(local_a8a8 + 0x10) =
                               (uint)bVar9 * *(int *)(local_a8a8 + 0x10) |
                               (uint)!bVar9 * iStack_a4b0;
                          *(uint *)(local_a8a8 + 0x14) =
                               (uint)bVar10 * *(int *)(local_a8a8 + 0x14) |
                               (uint)!bVar10 * iStack_a4ac;
                          *(uint *)(local_a8a8 + 0x18) =
                               (uint)bVar11 * *(int *)(local_a8a8 + 0x18) |
                               (uint)!bVar11 * iStack_a4a8;
                          *(uint *)(local_a8a8 + 0x1c) =
                               (uint)bVar12 * *(int *)(local_a8a8 + 0x1c) |
                               (uint)!bVar12 * iStack_a4a4;
                          *(uint *)(local_a8a8 + 0x20) =
                               (uint)bVar14 * *(int *)(local_a8a8 + 0x20) |
                               (uint)!bVar14 * iStack_a4a0;
                          *(uint *)(local_a8a8 + 0x24) =
                               (uint)bVar15 * *(int *)(local_a8a8 + 0x24) |
                               (uint)!bVar15 * iStack_a49c;
                          *(uint *)(local_a8a8 + 0x28) =
                               (uint)bVar16 * *(int *)(local_a8a8 + 0x28) |
                               (uint)!bVar16 * iStack_a498;
                          *(uint *)(local_a8a8 + 0x2c) =
                               (uint)bVar17 * *(int *)(local_a8a8 + 0x2c) |
                               (uint)!bVar17 * iStack_a494;
                          *(uint *)(local_a8a8 + 0x30) =
                               (uint)bVar18 * *(int *)(local_a8a8 + 0x30) |
                               (uint)!bVar18 * iStack_a490;
                          *(uint *)(local_a8a8 + 0x34) =
                               (uint)bVar19 * *(int *)(local_a8a8 + 0x34) |
                               (uint)!bVar19 * iStack_a48c;
                          *(uint *)(local_a8a8 + 0x38) =
                               (uint)bVar20 * *(int *)(local_a8a8 + 0x38) |
                               (uint)!bVar20 * iStack_a488;
                          *(uint *)(local_a8a8 + 0x3c) =
                               (uint)bVar21 * *(int *)(local_a8a8 + 0x3c) |
                               (uint)!bVar21 * iStack_a484;
                        }
                        uVar58 = uVar58 & (ushort)~uVar49;
                        uVar51 = local_a840._0_8_;
                      }
                      uVar49 = (ushort)uVar58;
                      if ((uVar49 == 0) || (bVar59 = 2 < uVar51, uVar51 = uVar51 + 1, bVar59))
                      break;
                    }
                    uVar49 = (ushort)local_a8e8 & uVar49;
                    local_a8e8 = (uint)uVar49;
                  } while ((uVar49 != 0) && (uVar60 = local_a888 + 1, uVar60 < local_a890));
                  uVar58 = ~local_a8e8;
                }
                uVar54 = uVar54 | uVar58;
                if ((short)uVar54 == -1) {
                  uVar54 = 0xffff;
                  goto LAB_01f62685;
                }
                auVar67 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                bVar59 = (bool)((byte)uVar54 & 1);
                local_a080._0_4_ = (uint)bVar59 * auVar67._0_4_ | (uint)!bVar59 * local_a080._0_4_;
                bVar59 = (bool)((byte)(uVar54 >> 1) & 1);
                local_a080._4_4_ = (uint)bVar59 * auVar67._4_4_ | (uint)!bVar59 * local_a080._4_4_;
                bVar59 = (bool)((byte)(uVar54 >> 2) & 1);
                local_a080._8_4_ = (uint)bVar59 * auVar67._8_4_ | (uint)!bVar59 * local_a080._8_4_;
                bVar59 = (bool)((byte)(uVar54 >> 3) & 1);
                local_a080._12_4_ =
                     (uint)bVar59 * auVar67._12_4_ | (uint)!bVar59 * local_a080._12_4_;
                bVar59 = (bool)((byte)(uVar54 >> 4) & 1);
                local_a080._16_4_ =
                     (uint)bVar59 * auVar67._16_4_ | (uint)!bVar59 * local_a080._16_4_;
                bVar59 = (bool)((byte)(uVar54 >> 5) & 1);
                local_a080._20_4_ =
                     (uint)bVar59 * auVar67._20_4_ | (uint)!bVar59 * local_a080._20_4_;
                bVar59 = (bool)((byte)(uVar54 >> 6) & 1);
                local_a080._24_4_ =
                     (uint)bVar59 * auVar67._24_4_ | (uint)!bVar59 * local_a080._24_4_;
                bVar59 = (bool)((byte)(uVar54 >> 7) & 1);
                local_a080._28_4_ =
                     (uint)bVar59 * auVar67._28_4_ | (uint)!bVar59 * local_a080._28_4_;
                bVar59 = (bool)((byte)(uVar54 >> 8) & 1);
                local_a080._32_4_ =
                     (uint)bVar59 * auVar67._32_4_ | (uint)!bVar59 * local_a080._32_4_;
                bVar59 = (bool)((byte)(uVar54 >> 9) & 1);
                local_a080._36_4_ =
                     (uint)bVar59 * auVar67._36_4_ | (uint)!bVar59 * local_a080._36_4_;
                bVar59 = (bool)((byte)(uVar54 >> 10) & 1);
                local_a080._40_4_ =
                     (uint)bVar59 * auVar67._40_4_ | (uint)!bVar59 * local_a080._40_4_;
                bVar59 = (bool)((byte)(uVar54 >> 0xb) & 1);
                local_a080._44_4_ =
                     (uint)bVar59 * auVar67._44_4_ | (uint)!bVar59 * local_a080._44_4_;
                bVar59 = (bool)((byte)(uVar54 >> 0xc) & 1);
                local_a080._48_4_ =
                     (uint)bVar59 * auVar67._48_4_ | (uint)!bVar59 * local_a080._48_4_;
                bVar59 = (bool)((byte)(uVar54 >> 0xd) & 1);
                local_a080._52_4_ =
                     (uint)bVar59 * auVar67._52_4_ | (uint)!bVar59 * local_a080._52_4_;
                bVar59 = (bool)((byte)(uVar54 >> 0xe) & 1);
                local_a080._56_4_ =
                     (uint)bVar59 * auVar67._56_4_ | (uint)!bVar59 * local_a080._56_4_;
                bVar59 = (bool)((byte)(uVar54 >> 0xf) & 1);
                local_a080._60_4_ =
                     (uint)bVar59 * auVar67._60_4_ | (uint)!bVar59 * local_a080._60_4_;
              }
              goto LAB_01f61872;
            }
            uVar60 = root.ptr & 0xfffffffffffffff0;
            root.ptr = 8;
            lVar50 = -0x20;
            auVar67 = auVar66;
            do {
              uVar51 = *(ulong *)(uVar60 + 0x40 + lVar50 * 2);
              if (uVar51 == 8) break;
              auVar64 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar60 + 0x120 + lVar50)));
              auVar76 = *(undefined1 (*) [64])(ray + 0x1c0);
              uVar57 = *(undefined4 *)(uVar60 + 0x60 + lVar50);
              auVar72._4_4_ = uVar57;
              auVar72._0_4_ = uVar57;
              auVar72._8_4_ = uVar57;
              auVar72._12_4_ = uVar57;
              auVar72._16_4_ = uVar57;
              auVar72._20_4_ = uVar57;
              auVar72._24_4_ = uVar57;
              auVar72._28_4_ = uVar57;
              auVar72._32_4_ = uVar57;
              auVar72._36_4_ = uVar57;
              auVar72._40_4_ = uVar57;
              auVar72._44_4_ = uVar57;
              auVar72._48_4_ = uVar57;
              auVar72._52_4_ = uVar57;
              auVar72._56_4_ = uVar57;
              auVar72._60_4_ = uVar57;
              auVar64 = vfmadd213ps_avx512f(auVar64,auVar76,auVar72);
              auVar70 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar60 + 0x160 + lVar50)));
              uVar57 = *(undefined4 *)(uVar60 + 0xa0 + lVar50);
              auVar73._4_4_ = uVar57;
              auVar73._0_4_ = uVar57;
              auVar73._8_4_ = uVar57;
              auVar73._12_4_ = uVar57;
              auVar73._16_4_ = uVar57;
              auVar73._20_4_ = uVar57;
              auVar73._24_4_ = uVar57;
              auVar73._28_4_ = uVar57;
              auVar73._32_4_ = uVar57;
              auVar73._36_4_ = uVar57;
              auVar73._40_4_ = uVar57;
              auVar73._44_4_ = uVar57;
              auVar73._48_4_ = uVar57;
              auVar73._52_4_ = uVar57;
              auVar73._56_4_ = uVar57;
              auVar73._60_4_ = uVar57;
              auVar70 = vfmadd213ps_avx512f(auVar70,auVar76,auVar73);
              auVar71 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar60 + 0x1a0 + lVar50)));
              uVar57 = *(undefined4 *)(uVar60 + 0xe0 + lVar50);
              auVar74._4_4_ = uVar57;
              auVar74._0_4_ = uVar57;
              auVar74._8_4_ = uVar57;
              auVar74._12_4_ = uVar57;
              auVar74._16_4_ = uVar57;
              auVar74._20_4_ = uVar57;
              auVar74._24_4_ = uVar57;
              auVar74._28_4_ = uVar57;
              auVar74._32_4_ = uVar57;
              auVar74._36_4_ = uVar57;
              auVar74._40_4_ = uVar57;
              auVar74._44_4_ = uVar57;
              auVar74._48_4_ = uVar57;
              auVar74._52_4_ = uVar57;
              auVar74._56_4_ = uVar57;
              auVar74._60_4_ = uVar57;
              auVar71 = vfmadd213ps_avx512f(auVar71,auVar76,auVar74);
              auVar72 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar60 + 0x140 + lVar50)));
              uVar57 = *(undefined4 *)(uVar60 + 0x80 + lVar50);
              auVar75._4_4_ = uVar57;
              auVar75._0_4_ = uVar57;
              auVar75._8_4_ = uVar57;
              auVar75._12_4_ = uVar57;
              auVar75._16_4_ = uVar57;
              auVar75._20_4_ = uVar57;
              auVar75._24_4_ = uVar57;
              auVar75._28_4_ = uVar57;
              auVar75._32_4_ = uVar57;
              auVar75._36_4_ = uVar57;
              auVar75._40_4_ = uVar57;
              auVar75._44_4_ = uVar57;
              auVar75._48_4_ = uVar57;
              auVar75._52_4_ = uVar57;
              auVar75._56_4_ = uVar57;
              auVar75._60_4_ = uVar57;
              auVar72 = vfmadd213ps_avx512f(auVar72,auVar76,auVar75);
              auVar73 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar60 + 0x180 + lVar50)));
              uVar57 = *(undefined4 *)(uVar60 + 0xc0 + lVar50);
              auVar80._4_4_ = uVar57;
              auVar80._0_4_ = uVar57;
              auVar80._8_4_ = uVar57;
              auVar80._12_4_ = uVar57;
              auVar80._16_4_ = uVar57;
              auVar80._20_4_ = uVar57;
              auVar80._24_4_ = uVar57;
              auVar80._28_4_ = uVar57;
              auVar80._32_4_ = uVar57;
              auVar80._36_4_ = uVar57;
              auVar80._40_4_ = uVar57;
              auVar80._44_4_ = uVar57;
              auVar80._48_4_ = uVar57;
              auVar80._52_4_ = uVar57;
              auVar80._56_4_ = uVar57;
              auVar80._60_4_ = uVar57;
              auVar73 = vfmadd213ps_avx512f(auVar73,auVar76,auVar80);
              auVar74 = vbroadcastss_avx512f(ZEXT416(*(uint *)(uVar60 + 0x1c0 + lVar50)));
              uVar57 = *(undefined4 *)(uVar60 + 0x100 + lVar50);
              auVar81._4_4_ = uVar57;
              auVar81._0_4_ = uVar57;
              auVar81._8_4_ = uVar57;
              auVar81._12_4_ = uVar57;
              auVar81._16_4_ = uVar57;
              auVar81._20_4_ = uVar57;
              auVar81._24_4_ = uVar57;
              auVar81._28_4_ = uVar57;
              auVar81._32_4_ = uVar57;
              auVar81._36_4_ = uVar57;
              auVar81._40_4_ = uVar57;
              auVar81._44_4_ = uVar57;
              auVar81._48_4_ = uVar57;
              auVar81._52_4_ = uVar57;
              auVar81._56_4_ = uVar57;
              auVar81._60_4_ = uVar57;
              auVar74 = vfmadd213ps_avx512f(auVar74,auVar76,auVar81);
              auVar75 = vfmsub213ps_avx512f(auVar64,local_a300,local_a240);
              auVar70 = vfmsub213ps_avx512f(auVar70,local_a2c0,local_a200);
              auVar71 = vfmsub213ps_avx512f(auVar71,local_a280,(undefined1  [64])local_a1c0);
              auVar72 = vfmsub213ps_avx512f(auVar72,local_a300,local_a240);
              aVar69 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)
                       vfmsub213ps_avx512f(auVar73,local_a2c0,local_a200);
              auVar64 = vfmsub213ps_avx512f(auVar74,local_a280,(undefined1  [64])local_a1c0);
              auVar73 = vpminsd_avx512f(auVar75,auVar72);
              auVar74 = vpminsd_avx512f(auVar70,(undefined1  [64])aVar69);
              auVar73 = vpmaxsd_avx512f(auVar73,auVar74);
              auVar74 = vpminsd_avx512f(auVar71,auVar64);
              auVar73 = vpmaxsd_avx512f(auVar73,auVar74);
              auVar72 = vpmaxsd_avx512f(auVar75,auVar72);
              auVar70 = vpmaxsd_avx512f(auVar70,(undefined1  [64])aVar69);
              auVar70 = vpminsd_avx512f(auVar72,auVar70);
              auVar71 = vpmaxsd_avx512f(auVar71,auVar64);
              auVar70 = vpminsd_avx512f(auVar70,auVar71);
              auVar82._4_4_ = uStack_a0bc;
              auVar82._0_4_ = local_a0c0;
              auVar82._8_4_ = uStack_a0b8;
              auVar82._12_4_ = uStack_a0b4;
              auVar82._16_4_ = uStack_a0b0;
              auVar82._20_4_ = uStack_a0ac;
              auVar82._24_4_ = uStack_a0a8;
              auVar82._28_4_ = uStack_a0a4;
              auVar82._32_4_ = uStack_a0a0;
              auVar82._36_4_ = uStack_a09c;
              auVar82._40_4_ = uStack_a098;
              auVar82._44_4_ = uStack_a094;
              auVar82._48_4_ = uStack_a090;
              auVar82._52_4_ = uStack_a08c;
              auVar82._56_4_ = uStack_a088;
              auVar82._60_4_ = uStack_a084;
              auVar71 = vpmaxsd_avx512f(auVar73,auVar82);
              auVar70 = vpminsd_avx512f(auVar70,local_a080);
              uVar61 = vcmpps_avx512f(auVar71,auVar70,2);
              if ((uVar58 & 7) == 6) {
                uVar57 = *(undefined4 *)(uVar60 + 0x1e0 + lVar50);
                auVar79._4_4_ = uVar57;
                auVar79._0_4_ = uVar57;
                auVar79._8_4_ = uVar57;
                auVar79._12_4_ = uVar57;
                auVar79._16_4_ = uVar57;
                auVar79._20_4_ = uVar57;
                auVar79._24_4_ = uVar57;
                auVar79._28_4_ = uVar57;
                auVar79._32_4_ = uVar57;
                auVar79._36_4_ = uVar57;
                auVar79._40_4_ = uVar57;
                auVar79._44_4_ = uVar57;
                auVar79._48_4_ = uVar57;
                auVar79._52_4_ = uVar57;
                auVar79._56_4_ = uVar57;
                auVar79._60_4_ = uVar57;
                uVar53 = vcmpps_avx512f(auVar76,auVar79,0xd);
                uVar57 = *(undefined4 *)(uVar60 + 0x200 + lVar50);
                auVar83._4_4_ = uVar57;
                auVar83._0_4_ = uVar57;
                auVar83._8_4_ = uVar57;
                auVar83._12_4_ = uVar57;
                auVar83._16_4_ = uVar57;
                auVar83._20_4_ = uVar57;
                auVar83._24_4_ = uVar57;
                auVar83._28_4_ = uVar57;
                auVar83._32_4_ = uVar57;
                auVar83._36_4_ = uVar57;
                auVar83._40_4_ = uVar57;
                auVar83._44_4_ = uVar57;
                auVar83._48_4_ = uVar57;
                auVar83._52_4_ = uVar57;
                auVar83._56_4_ = uVar57;
                auVar83._60_4_ = uVar57;
                uVar22 = vcmpps_avx512f(auVar76,auVar83,1);
                uVar61 = uVar61 & uVar53 & uVar22;
              }
              uVar53 = vcmpps_avx512f(local_a080,auVar78,6);
              uVar61 = uVar61 & uVar53;
              uVar53 = root.ptr;
              auVar84 = auVar67;
              if ((short)uVar61 != 0) {
                auVar70 = vblendmps_avx512f(auVar66,auVar73);
                bVar59 = (bool)((byte)uVar61 & 1);
                auVar84._0_4_ = (uint)bVar59 * auVar70._0_4_ | (uint)!bVar59 * auVar76._0_4_;
                bVar59 = (bool)((byte)(uVar61 >> 1) & 1);
                auVar84._4_4_ = (uint)bVar59 * auVar70._4_4_ | (uint)!bVar59 * auVar76._4_4_;
                bVar59 = (bool)((byte)(uVar61 >> 2) & 1);
                auVar84._8_4_ = (uint)bVar59 * auVar70._8_4_ | (uint)!bVar59 * auVar76._8_4_;
                bVar59 = (bool)((byte)(uVar61 >> 3) & 1);
                auVar84._12_4_ = (uint)bVar59 * auVar70._12_4_ | (uint)!bVar59 * auVar76._12_4_;
                bVar59 = (bool)((byte)(uVar61 >> 4) & 1);
                auVar84._16_4_ = (uint)bVar59 * auVar70._16_4_ | (uint)!bVar59 * auVar76._16_4_;
                bVar59 = (bool)((byte)(uVar61 >> 5) & 1);
                auVar84._20_4_ = (uint)bVar59 * auVar70._20_4_ | (uint)!bVar59 * auVar76._20_4_;
                bVar59 = (bool)((byte)(uVar61 >> 6) & 1);
                auVar84._24_4_ = (uint)bVar59 * auVar70._24_4_ | (uint)!bVar59 * auVar76._24_4_;
                bVar59 = (bool)((byte)(uVar61 >> 7) & 1);
                auVar84._28_4_ = (uint)bVar59 * auVar70._28_4_ | (uint)!bVar59 * auVar76._28_4_;
                bVar59 = (bool)((byte)(uVar61 >> 8) & 1);
                auVar84._32_4_ = (uint)bVar59 * auVar70._32_4_ | (uint)!bVar59 * auVar76._32_4_;
                bVar59 = (bool)((byte)(uVar61 >> 9) & 1);
                auVar84._36_4_ = (uint)bVar59 * auVar70._36_4_ | (uint)!bVar59 * auVar76._36_4_;
                bVar59 = (bool)((byte)(uVar61 >> 10) & 1);
                auVar84._40_4_ = (uint)bVar59 * auVar70._40_4_ | (uint)!bVar59 * auVar76._40_4_;
                bVar59 = (bool)((byte)(uVar61 >> 0xb) & 1);
                auVar84._44_4_ = (uint)bVar59 * auVar70._44_4_ | (uint)!bVar59 * auVar76._44_4_;
                bVar59 = (bool)((byte)(uVar61 >> 0xc) & 1);
                auVar84._48_4_ = (uint)bVar59 * auVar70._48_4_ | (uint)!bVar59 * auVar76._48_4_;
                bVar59 = (bool)((byte)(uVar61 >> 0xd) & 1);
                auVar84._52_4_ = (uint)bVar59 * auVar70._52_4_ | (uint)!bVar59 * auVar76._52_4_;
                bVar59 = (bool)((byte)(uVar61 >> 0xe) & 1);
                auVar84._56_4_ = (uint)bVar59 * auVar70._56_4_ | (uint)!bVar59 * auVar76._56_4_;
                bVar59 = SUB81(uVar61 >> 0xf,0);
                auVar84._60_4_ = (uint)bVar59 * auVar70._60_4_ | (uint)!bVar59 * auVar76._60_4_;
                uVar53 = uVar51;
                if (root.ptr != 8) {
                  *puVar56 = root.ptr;
                  puVar56 = puVar56 + 1;
                  *pauVar52 = auVar67;
                  pauVar52 = pauVar52 + 1;
                }
              }
              auVar67 = auVar84;
              root.ptr = uVar53;
              lVar50 = lVar50 + 4;
              in_ZMM14 = local_a1c0;
            } while (lVar50 != 0);
            iVar62 = 4;
            if (root.ptr == 8) goto LAB_01f61ab3;
            uVar23 = vcmpps_avx512f(auVar67,local_a080,9);
            auVar78 = auVar67;
          } while ((ushort)uVar55 < (ushort)POPCOUNT((int)uVar23));
          *puVar56 = root.ptr;
          puVar56 = puVar56 + 1;
          *pauVar52 = auVar67;
          pauVar52 = pauVar52 + 1;
        }
        else {
          do {
            local_a840 = auVar78;
            k = 0;
            for (uVar51 = uVar60; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000) {
              k = k + 1;
            }
            aVar69 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)ZEXT1664(aVar69._0_16_);
            auVar64 = ZEXT1664(auVar64._0_16_);
            in_ZMM14 = (anon_union_64_3_4e90abd3_for_vfloat_impl<16>_1)ZEXT1664(in_ZMM14._0_16_);
            bVar59 = occluded1(local_a898,local_a8a0,root,k,&local_a8c1,ray,
                               (TravRayK<16,_false> *)&local_a480.field_0,context);
            uVar58 = 1 << ((uint)k & 0x1f);
            if (!bVar59) {
              uVar58 = 0;
            }
            uVar54 = uVar54 | uVar58;
            uVar60 = uVar60 - 1 & uVar60;
            auVar78 = local_a840;
          } while (uVar60 != 0);
          if ((short)uVar54 == -1) {
            iVar62 = 3;
          }
          else {
            auVar103 = vbroadcastss_avx512f(ZEXT416(0xff800000));
            bVar59 = (bool)((byte)uVar54 & 1);
            local_a080._0_4_ = (uint)bVar59 * auVar103._0_4_ | (uint)!bVar59 * local_a080._0_4_;
            bVar59 = (bool)((byte)(uVar54 >> 1) & 1);
            local_a080._4_4_ = (uint)bVar59 * auVar103._4_4_ | (uint)!bVar59 * local_a080._4_4_;
            bVar59 = (bool)((byte)(uVar54 >> 2) & 1);
            local_a080._8_4_ = (uint)bVar59 * auVar103._8_4_ | (uint)!bVar59 * local_a080._8_4_;
            bVar59 = (bool)((byte)(uVar54 >> 3) & 1);
            local_a080._12_4_ = (uint)bVar59 * auVar103._12_4_ | (uint)!bVar59 * local_a080._12_4_;
            bVar59 = (bool)((byte)(uVar54 >> 4) & 1);
            local_a080._16_4_ = (uint)bVar59 * auVar103._16_4_ | (uint)!bVar59 * local_a080._16_4_;
            bVar59 = (bool)((byte)(uVar54 >> 5) & 1);
            local_a080._20_4_ = (uint)bVar59 * auVar103._20_4_ | (uint)!bVar59 * local_a080._20_4_;
            bVar59 = (bool)((byte)(uVar54 >> 6) & 1);
            local_a080._24_4_ = (uint)bVar59 * auVar103._24_4_ | (uint)!bVar59 * local_a080._24_4_;
            bVar59 = (bool)((byte)(uVar54 >> 7) & 1);
            local_a080._28_4_ = (uint)bVar59 * auVar103._28_4_ | (uint)!bVar59 * local_a080._28_4_;
            bVar59 = (bool)((byte)(uVar54 >> 8) & 1);
            local_a080._32_4_ = (uint)bVar59 * auVar103._32_4_ | (uint)!bVar59 * local_a080._32_4_;
            bVar59 = (bool)((byte)(uVar54 >> 9) & 1);
            local_a080._36_4_ = (uint)bVar59 * auVar103._36_4_ | (uint)!bVar59 * local_a080._36_4_;
            bVar59 = (bool)((byte)(uVar54 >> 10) & 1);
            local_a080._40_4_ = (uint)bVar59 * auVar103._40_4_ | (uint)!bVar59 * local_a080._40_4_;
            bVar59 = (bool)((byte)(uVar54 >> 0xb) & 1);
            local_a080._44_4_ = (uint)bVar59 * auVar103._44_4_ | (uint)!bVar59 * local_a080._44_4_;
            bVar59 = (bool)((byte)(uVar54 >> 0xc) & 1);
            local_a080._48_4_ = (uint)bVar59 * auVar103._48_4_ | (uint)!bVar59 * local_a080._48_4_;
            bVar59 = (bool)((byte)(uVar54 >> 0xd) & 1);
            local_a080._52_4_ = (uint)bVar59 * auVar103._52_4_ | (uint)!bVar59 * local_a080._52_4_;
            bVar59 = (bool)((byte)(uVar54 >> 0xe) & 1);
            local_a080._56_4_ = (uint)bVar59 * auVar103._56_4_ | (uint)!bVar59 * local_a080._56_4_;
            bVar59 = (bool)((byte)(uVar54 >> 0xf) & 1);
            local_a080._60_4_ = (uint)bVar59 * auVar103._60_4_ | (uint)!bVar59 * local_a080._60_4_;
            iVar62 = 2;
          }
          auVar66 = vbroadcastss_avx512f(ZEXT416(0x7f800000));
          auVar68 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar63 = vxorps_avx512vl(auVar65._0_16_,auVar65._0_16_);
          auVar65 = ZEXT1664(auVar63);
          auVar103 = vbroadcastsd_avx512f(ZEXT816(0x8000000080000000));
          if (uVar55 < (uint)POPCOUNT(uVar57)) goto LAB_01f618b6;
        }
LAB_01f61ab3:
      } while ((iVar62 == 4) || (iVar62 == 2));
LAB_01f62685:
      uVar54 = uVar54 & local_a8ac;
      auVar64 = vbroadcastss_avx512f(ZEXT416(0xff800000));
      bVar59 = (bool)((byte)uVar54 & 1);
      bVar6 = (bool)((byte)(uVar54 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar54 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar54 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar54 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar54 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar54 >> 6) & 1);
      bVar12 = (bool)((byte)(uVar54 >> 7) & 1);
      bVar14 = (bool)((byte)(uVar54 >> 8) & 1);
      bVar15 = (bool)((byte)(uVar54 >> 9) & 1);
      bVar16 = (bool)((byte)(uVar54 >> 10) & 1);
      bVar17 = (bool)((byte)(uVar54 >> 0xb) & 1);
      bVar18 = (bool)((byte)(uVar54 >> 0xc) & 1);
      bVar19 = (bool)((byte)(uVar54 >> 0xd) & 1);
      bVar20 = (bool)((byte)(uVar54 >> 0xe) & 1);
      bVar21 = (bool)((byte)(uVar54 >> 0xf) & 1);
      *(uint *)local_a8a8 = (uint)bVar59 * auVar64._0_4_ | (uint)!bVar59 * *(int *)local_a8a8;
      *(uint *)(local_a8a8 + 4) =
           (uint)bVar6 * auVar64._4_4_ | (uint)!bVar6 * *(int *)(local_a8a8 + 4);
      *(uint *)(local_a8a8 + 8) =
           (uint)bVar7 * auVar64._8_4_ | (uint)!bVar7 * *(int *)(local_a8a8 + 8);
      *(uint *)(local_a8a8 + 0xc) =
           (uint)bVar8 * auVar64._12_4_ | (uint)!bVar8 * *(int *)(local_a8a8 + 0xc);
      *(uint *)(local_a8a8 + 0x10) =
           (uint)bVar9 * auVar64._16_4_ | (uint)!bVar9 * *(int *)(local_a8a8 + 0x10);
      *(uint *)(local_a8a8 + 0x14) =
           (uint)bVar10 * auVar64._20_4_ | (uint)!bVar10 * *(int *)(local_a8a8 + 0x14);
      *(uint *)(local_a8a8 + 0x18) =
           (uint)bVar11 * auVar64._24_4_ | (uint)!bVar11 * *(int *)(local_a8a8 + 0x18);
      *(uint *)(local_a8a8 + 0x1c) =
           (uint)bVar12 * auVar64._28_4_ | (uint)!bVar12 * *(int *)(local_a8a8 + 0x1c);
      *(uint *)(local_a8a8 + 0x20) =
           (uint)bVar14 * auVar64._32_4_ | (uint)!bVar14 * *(int *)(local_a8a8 + 0x20);
      *(uint *)(local_a8a8 + 0x24) =
           (uint)bVar15 * auVar64._36_4_ | (uint)!bVar15 * *(int *)(local_a8a8 + 0x24);
      *(uint *)(local_a8a8 + 0x28) =
           (uint)bVar16 * auVar64._40_4_ | (uint)!bVar16 * *(int *)(local_a8a8 + 0x28);
      *(uint *)(local_a8a8 + 0x2c) =
           (uint)bVar17 * auVar64._44_4_ | (uint)!bVar17 * *(int *)(local_a8a8 + 0x2c);
      *(uint *)(local_a8a8 + 0x30) =
           (uint)bVar18 * auVar64._48_4_ | (uint)!bVar18 * *(int *)(local_a8a8 + 0x30);
      *(uint *)(local_a8a8 + 0x34) =
           (uint)bVar19 * auVar64._52_4_ | (uint)!bVar19 * *(int *)(local_a8a8 + 0x34);
      *(uint *)(local_a8a8 + 0x38) =
           (uint)bVar20 * auVar64._56_4_ | (uint)!bVar20 * *(int *)(local_a8a8 + 0x38);
      *(uint *)(local_a8a8 + 0x3c) =
           (uint)bVar21 * auVar64._60_4_ | (uint)!bVar21 * *(int *)(local_a8a8 + 0x3c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }